

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiMBIntersectorK<8,16>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,16,8>,embree::avx512::Occluded1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  uint uVar1;
  int iVar2;
  int iVar3;
  float *pfVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint uVar12;
  int iVar13;
  Geometry *pGVar14;
  __int_type_conflict _Var15;
  long lVar16;
  RTCFilterFunctionN p_Var17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  undefined8 uVar33;
  ulong uVar34;
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  byte bVar77;
  ulong uVar78;
  long lVar79;
  Geometry *geometry;
  long lVar80;
  long lVar81;
  bool bVar82;
  ulong uVar83;
  undefined8 unaff_R13;
  ulong uVar84;
  byte bVar85;
  float fVar86;
  float fVar87;
  float fVar138;
  float fVar140;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar91 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar92 [16];
  float fVar139;
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  float fVar144;
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [64];
  undefined1 auVar137 [64];
  undefined1 auVar146 [16];
  undefined4 uVar145;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [64];
  float fVar150;
  float fVar151;
  undefined8 uVar152;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar159;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  undefined1 auVar177 [32];
  float fVar179;
  undefined1 auVar178 [16];
  uint uVar180;
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  RTCFilterFunctionNArguments local_890;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_810 [16];
  undefined1 local_800 [16];
  undefined1 local_7f0 [16];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  LinearSpace3fa *local_750;
  Primitive *local_748;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6b0 [8];
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  uint local_680;
  uint uStack_67c;
  uint uStack_678;
  uint uStack_674;
  uint uStack_670;
  uint uStack_66c;
  uint uStack_668;
  uint uStack_664;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [64];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined4 local_580;
  int local_57c;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  float local_520 [4];
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined4 uStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  uVar78 = (ulong)(byte)prim[1];
  lVar79 = uVar78 * 0x25;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar78 * 4 + 6);
  auVar107 = vpmovsxbd_avx2(auVar89);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar78 * 5 + 6);
  auVar104 = vpmovsxbd_avx2(auVar88);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar78 * 6 + 6);
  auVar110 = vpmovsxbd_avx2(auVar90);
  auVar154._8_8_ = 0;
  auVar154._0_8_ = *(ulong *)(prim + uVar78 * 0xf + 6);
  auVar109 = vpmovsxbd_avx2(auVar154);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar108 = vpmovsxbd_avx2(auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar78 * 0x11 + 6);
  auVar105 = vpmovsxbd_avx2(auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar78 * 0x1a + 6);
  auVar106 = vpmovsxbd_avx2(auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar78 * 0x1b + 6);
  auVar99 = vpmovsxbd_avx2(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar78 * 0x1c + 6);
  auVar100 = vpmovsxbd_avx2(auVar11);
  uVar145 = *(undefined4 *)(prim + lVar79 + 0x12);
  auVar91._4_4_ = uVar145;
  auVar91._0_4_ = uVar145;
  auVar91._8_4_ = uVar145;
  auVar91._12_4_ = uVar145;
  auVar89 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar89 = vinsertps_avx(auVar89,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar88 = vsubps_avx512vl(auVar89,*(undefined1 (*) [16])(prim + lVar79 + 6));
  fVar151 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar79 + 0x16)) *
            *(float *)(prim + lVar79 + 0x1a);
  auVar111 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 7 + 6));
  auVar112 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 0xb + 6));
  auVar113 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 9 + 6));
  auVar114 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 0xd + 6));
  auVar93 = vpbroadcastd_avx512vl();
  auVar89 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar89 = vinsertps_avx512f(auVar89,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar88 = vmulps_avx512vl(auVar91,auVar88);
  auVar89 = vmulps_avx512vl(auVar91,auVar89);
  auVar94 = vcvtdq2ps_avx512vl(auVar107);
  auVar95 = vcvtdq2ps_avx512vl(auVar104);
  auVar96 = vcvtdq2ps_avx512vl(auVar110);
  auVar97 = vcvtdq2ps_avx512vl(auVar109);
  auVar98 = vcvtdq2ps_avx512vl(auVar108);
  auVar107 = vcvtdq2ps_avx(auVar105);
  auVar110 = vcvtdq2ps_avx(auVar106);
  auVar109 = vcvtdq2ps_avx(auVar99);
  auVar108 = vcvtdq2ps_avx(auVar100);
  uVar145 = auVar89._0_4_;
  auVar166._4_4_ = uVar145;
  auVar166._0_4_ = uVar145;
  auVar166._8_4_ = uVar145;
  auVar166._12_4_ = uVar145;
  auVar166._16_4_ = uVar145;
  auVar166._20_4_ = uVar145;
  auVar166._24_4_ = uVar145;
  auVar166._28_4_ = uVar145;
  auVar99 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar100 = vpermps_avx512vl(auVar99,ZEXT1632(auVar89));
  auVar101 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar102 = vpermps_avx512vl(auVar101,ZEXT1632(auVar89));
  auVar103 = vmulps_avx512vl(auVar102,auVar96);
  auVar105._4_4_ = auVar102._4_4_ * auVar107._4_4_;
  auVar105._0_4_ = auVar102._0_4_ * auVar107._0_4_;
  auVar105._8_4_ = auVar102._8_4_ * auVar107._8_4_;
  auVar105._12_4_ = auVar102._12_4_ * auVar107._12_4_;
  auVar105._16_4_ = auVar102._16_4_ * auVar107._16_4_;
  auVar105._20_4_ = auVar102._20_4_ * auVar107._20_4_;
  auVar105._24_4_ = auVar102._24_4_ * auVar107._24_4_;
  auVar105._28_4_ = auVar104._28_4_;
  auVar106._4_4_ = auVar108._4_4_ * auVar102._4_4_;
  auVar106._0_4_ = auVar108._0_4_ * auVar102._0_4_;
  auVar106._8_4_ = auVar108._8_4_ * auVar102._8_4_;
  auVar106._12_4_ = auVar108._12_4_ * auVar102._12_4_;
  auVar106._16_4_ = auVar108._16_4_ * auVar102._16_4_;
  auVar106._20_4_ = auVar108._20_4_ * auVar102._20_4_;
  auVar106._24_4_ = auVar108._24_4_ * auVar102._24_4_;
  auVar106._28_4_ = auVar102._28_4_;
  auVar104 = vfmadd231ps_avx512vl(auVar103,auVar100,auVar95);
  auVar105 = vfmadd231ps_avx512vl(auVar105,auVar100,auVar98);
  auVar89 = vfmadd231ps_fma(auVar106,auVar109,auVar100);
  auVar104 = vfmadd231ps_avx512vl(auVar104,auVar166,auVar94);
  auVar105 = vfmadd231ps_avx512vl(auVar105,auVar166,auVar97);
  auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar110,auVar166);
  auVar106 = vbroadcastss_avx512vl(auVar88);
  auVar99 = vpermps_avx512vl(auVar99,ZEXT1632(auVar88));
  auVar100 = vpermps_avx512vl(auVar101,ZEXT1632(auVar88));
  auVar96 = vmulps_avx512vl(auVar100,auVar96);
  auVar107 = vmulps_avx512vl(auVar100,auVar107);
  auVar108 = vmulps_avx512vl(auVar100,auVar108);
  auVar100 = vfmadd231ps_avx512vl(auVar96,auVar99,auVar95);
  auVar107 = vfmadd231ps_avx512vl(auVar107,auVar99,auVar98);
  auVar109 = vfmadd231ps_avx512vl(auVar108,auVar99,auVar109);
  auVar108 = vfmadd231ps_avx512vl(auVar100,auVar106,auVar94);
  auVar94 = vfmadd231ps_avx512vl(auVar107,auVar106,auVar97);
  auVar91 = vfmadd231ps_fma(auVar109,auVar106,auVar110);
  auVar101._8_4_ = 0x7fffffff;
  auVar101._0_8_ = 0x7fffffff7fffffff;
  auVar101._12_4_ = 0x7fffffff;
  auVar101._16_4_ = 0x7fffffff;
  auVar101._20_4_ = 0x7fffffff;
  auVar101._24_4_ = 0x7fffffff;
  auVar101._28_4_ = 0x7fffffff;
  auVar107 = vandps_avx(auVar101,auVar104);
  auVar98._8_4_ = 0x219392ef;
  auVar98._0_8_ = 0x219392ef219392ef;
  auVar98._12_4_ = 0x219392ef;
  auVar98._16_4_ = 0x219392ef;
  auVar98._20_4_ = 0x219392ef;
  auVar98._24_4_ = 0x219392ef;
  auVar98._28_4_ = 0x219392ef;
  uVar84 = vcmpps_avx512vl(auVar107,auVar98,1);
  bVar82 = (bool)((byte)uVar84 & 1);
  auVar95._0_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar104._0_4_;
  bVar82 = (bool)((byte)(uVar84 >> 1) & 1);
  auVar95._4_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar104._4_4_;
  bVar82 = (bool)((byte)(uVar84 >> 2) & 1);
  auVar95._8_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar104._8_4_;
  bVar82 = (bool)((byte)(uVar84 >> 3) & 1);
  auVar95._12_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar104._12_4_;
  bVar82 = (bool)((byte)(uVar84 >> 4) & 1);
  auVar95._16_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar104._16_4_;
  bVar82 = (bool)((byte)(uVar84 >> 5) & 1);
  auVar95._20_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar104._20_4_;
  bVar82 = (bool)((byte)(uVar84 >> 6) & 1);
  auVar95._24_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar104._24_4_;
  bVar82 = SUB81(uVar84 >> 7,0);
  auVar95._28_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar104._28_4_;
  auVar107 = vandps_avx(auVar101,auVar105);
  uVar84 = vcmpps_avx512vl(auVar107,auVar98,1);
  bVar82 = (bool)((byte)uVar84 & 1);
  auVar96._0_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar105._0_4_;
  bVar82 = (bool)((byte)(uVar84 >> 1) & 1);
  auVar96._4_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar105._4_4_;
  bVar82 = (bool)((byte)(uVar84 >> 2) & 1);
  auVar96._8_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar105._8_4_;
  bVar82 = (bool)((byte)(uVar84 >> 3) & 1);
  auVar96._12_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar105._12_4_;
  bVar82 = (bool)((byte)(uVar84 >> 4) & 1);
  auVar96._16_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar105._16_4_;
  bVar82 = (bool)((byte)(uVar84 >> 5) & 1);
  auVar96._20_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar105._20_4_;
  bVar82 = (bool)((byte)(uVar84 >> 6) & 1);
  auVar96._24_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar105._24_4_;
  bVar82 = SUB81(uVar84 >> 7,0);
  auVar96._28_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar105._28_4_;
  auVar107 = vandps_avx(auVar101,ZEXT1632(auVar89));
  uVar84 = vcmpps_avx512vl(auVar107,auVar98,1);
  bVar82 = (bool)((byte)uVar84 & 1);
  auVar107._0_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar89._0_4_;
  bVar82 = (bool)((byte)(uVar84 >> 1) & 1);
  auVar107._4_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar89._4_4_;
  bVar82 = (bool)((byte)(uVar84 >> 2) & 1);
  auVar107._8_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar89._8_4_;
  bVar82 = (bool)((byte)(uVar84 >> 3) & 1);
  auVar107._12_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar89._12_4_;
  auVar107._16_4_ = (uint)((byte)(uVar84 >> 4) & 1) * 0x219392ef;
  auVar107._20_4_ = (uint)((byte)(uVar84 >> 5) & 1) * 0x219392ef;
  auVar107._24_4_ = (uint)((byte)(uVar84 >> 6) & 1) * 0x219392ef;
  auVar107._28_4_ = (uint)(byte)(uVar84 >> 7) * 0x219392ef;
  auVar110 = vrcp14ps_avx512vl(auVar95);
  auVar109 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar104 = vfnmadd213ps_avx512vl(auVar95,auVar110,auVar109);
  auVar89 = vfmadd132ps_fma(auVar104,auVar110,auVar110);
  auVar110 = vrcp14ps_avx512vl(auVar96);
  auVar104 = vfnmadd213ps_avx512vl(auVar96,auVar110,auVar109);
  auVar88 = vfmadd132ps_fma(auVar104,auVar110,auVar110);
  auVar110 = vrcp14ps_avx512vl(auVar107);
  auVar107 = vfnmadd213ps_avx512vl(auVar107,auVar110,auVar109);
  auVar90 = vfmadd132ps_fma(auVar107,auVar110,auVar110);
  auVar97._4_4_ = fVar151;
  auVar97._0_4_ = fVar151;
  auVar97._8_4_ = fVar151;
  auVar97._12_4_ = fVar151;
  auVar97._16_4_ = fVar151;
  auVar97._20_4_ = fVar151;
  auVar97._24_4_ = fVar151;
  auVar97._28_4_ = fVar151;
  auVar107 = vcvtdq2ps_avx(auVar111);
  auVar110 = vcvtdq2ps_avx(auVar112);
  auVar110 = vsubps_avx(auVar110,auVar107);
  auVar154 = vfmadd213ps_fma(auVar110,auVar97,auVar107);
  auVar107 = vcvtdq2ps_avx(auVar113);
  auVar110 = vcvtdq2ps_avx(auVar114);
  auVar110 = vsubps_avx(auVar110,auVar107);
  auVar7 = vfmadd213ps_fma(auVar110,auVar97,auVar107);
  auVar107 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 0x12 + 6));
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar110 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 0x16 + 6));
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar110 = vsubps_avx(auVar110,auVar107);
  auVar109 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 0x14 + 6));
  auVar8 = vfmadd213ps_fma(auVar110,auVar97,auVar107);
  auVar107 = vcvtdq2ps_avx(auVar109);
  auVar110 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 0x18 + 6));
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar110 = vsubps_avx(auVar110,auVar107);
  auVar9 = vfmadd213ps_fma(auVar110,auVar97,auVar107);
  auVar107 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 0x1d + 6));
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar110 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 0x21 + 6));
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar110 = vsubps_avx(auVar110,auVar107);
  auVar10 = vfmadd213ps_fma(auVar110,auVar97,auVar107);
  auVar107 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 0x1f + 6));
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar110 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 0x23 + 6));
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar110 = vsubps_avx(auVar110,auVar107);
  auVar11 = vfmadd213ps_fma(auVar110,auVar97,auVar107);
  auVar107 = vsubps_avx(ZEXT1632(auVar154),auVar108);
  auVar99._4_4_ = auVar89._4_4_ * auVar107._4_4_;
  auVar99._0_4_ = auVar89._0_4_ * auVar107._0_4_;
  auVar99._8_4_ = auVar89._8_4_ * auVar107._8_4_;
  auVar99._12_4_ = auVar89._12_4_ * auVar107._12_4_;
  auVar99._16_4_ = auVar107._16_4_ * 0.0;
  auVar99._20_4_ = auVar107._20_4_ * 0.0;
  auVar99._24_4_ = auVar107._24_4_ * 0.0;
  auVar99._28_4_ = auVar107._28_4_;
  auVar107 = vsubps_avx(ZEXT1632(auVar7),auVar108);
  auVar114._0_4_ = auVar89._0_4_ * auVar107._0_4_;
  auVar114._4_4_ = auVar89._4_4_ * auVar107._4_4_;
  auVar114._8_4_ = auVar89._8_4_ * auVar107._8_4_;
  auVar114._12_4_ = auVar89._12_4_ * auVar107._12_4_;
  auVar114._16_4_ = auVar107._16_4_ * 0.0;
  auVar114._20_4_ = auVar107._20_4_ * 0.0;
  auVar114._24_4_ = auVar107._24_4_ * 0.0;
  auVar114._28_4_ = 0;
  auVar107 = vsubps_avx(ZEXT1632(auVar8),auVar94);
  auVar100._4_4_ = auVar88._4_4_ * auVar107._4_4_;
  auVar100._0_4_ = auVar88._0_4_ * auVar107._0_4_;
  auVar100._8_4_ = auVar88._8_4_ * auVar107._8_4_;
  auVar100._12_4_ = auVar88._12_4_ * auVar107._12_4_;
  auVar100._16_4_ = auVar107._16_4_ * 0.0;
  auVar100._20_4_ = auVar107._20_4_ * 0.0;
  auVar100._24_4_ = auVar107._24_4_ * 0.0;
  auVar100._28_4_ = auVar107._28_4_;
  auVar107 = vsubps_avx(ZEXT1632(auVar9),auVar94);
  auVar113._0_4_ = auVar88._0_4_ * auVar107._0_4_;
  auVar113._4_4_ = auVar88._4_4_ * auVar107._4_4_;
  auVar113._8_4_ = auVar88._8_4_ * auVar107._8_4_;
  auVar113._12_4_ = auVar88._12_4_ * auVar107._12_4_;
  auVar113._16_4_ = auVar107._16_4_ * 0.0;
  auVar113._20_4_ = auVar107._20_4_ * 0.0;
  auVar113._24_4_ = auVar107._24_4_ * 0.0;
  auVar113._28_4_ = 0;
  auVar107 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar91));
  auVar111._4_4_ = auVar90._4_4_ * auVar107._4_4_;
  auVar111._0_4_ = auVar90._0_4_ * auVar107._0_4_;
  auVar111._8_4_ = auVar90._8_4_ * auVar107._8_4_;
  auVar111._12_4_ = auVar90._12_4_ * auVar107._12_4_;
  auVar111._16_4_ = auVar107._16_4_ * 0.0;
  auVar111._20_4_ = auVar107._20_4_ * 0.0;
  auVar111._24_4_ = auVar107._24_4_ * 0.0;
  auVar111._28_4_ = auVar107._28_4_;
  auVar107 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar91));
  auVar112._0_4_ = auVar90._0_4_ * auVar107._0_4_;
  auVar112._4_4_ = auVar90._4_4_ * auVar107._4_4_;
  auVar112._8_4_ = auVar90._8_4_ * auVar107._8_4_;
  auVar112._12_4_ = auVar90._12_4_ * auVar107._12_4_;
  auVar112._16_4_ = auVar107._16_4_ * 0.0;
  auVar112._20_4_ = auVar107._20_4_ * 0.0;
  auVar112._24_4_ = auVar107._24_4_ * 0.0;
  auVar112._28_4_ = 0;
  auVar107 = vpminsd_avx2(auVar99,auVar114);
  auVar110 = vpminsd_avx2(auVar100,auVar113);
  auVar107 = vmaxps_avx(auVar107,auVar110);
  auVar110 = vpminsd_avx2(auVar111,auVar112);
  uVar145 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar109._4_4_ = uVar145;
  auVar109._0_4_ = uVar145;
  auVar109._8_4_ = uVar145;
  auVar109._12_4_ = uVar145;
  auVar109._16_4_ = uVar145;
  auVar109._20_4_ = uVar145;
  auVar109._24_4_ = uVar145;
  auVar109._28_4_ = uVar145;
  auVar110 = vmaxps_avx512vl(auVar110,auVar109);
  auVar107 = vmaxps_avx(auVar107,auVar110);
  auVar110._8_4_ = 0x3f7ffffa;
  auVar110._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar110._12_4_ = 0x3f7ffffa;
  auVar110._16_4_ = 0x3f7ffffa;
  auVar110._20_4_ = 0x3f7ffffa;
  auVar110._24_4_ = 0x3f7ffffa;
  auVar110._28_4_ = 0x3f7ffffa;
  local_360 = vmulps_avx512vl(auVar107,auVar110);
  auVar107 = vpmaxsd_avx2(auVar99,auVar114);
  auVar110 = vpmaxsd_avx2(auVar100,auVar113);
  auVar107 = vminps_avx(auVar107,auVar110);
  auVar110 = vpmaxsd_avx2(auVar111,auVar112);
  uVar145 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar108._4_4_ = uVar145;
  auVar108._0_4_ = uVar145;
  auVar108._8_4_ = uVar145;
  auVar108._12_4_ = uVar145;
  auVar108._16_4_ = uVar145;
  auVar108._20_4_ = uVar145;
  auVar108._24_4_ = uVar145;
  auVar108._28_4_ = uVar145;
  auVar110 = vminps_avx512vl(auVar110,auVar108);
  auVar107 = vminps_avx(auVar107,auVar110);
  auVar104._8_4_ = 0x3f800003;
  auVar104._0_8_ = 0x3f8000033f800003;
  auVar104._12_4_ = 0x3f800003;
  auVar104._16_4_ = 0x3f800003;
  auVar104._20_4_ = 0x3f800003;
  auVar104._24_4_ = 0x3f800003;
  auVar104._28_4_ = 0x3f800003;
  auVar107 = vmulps_avx512vl(auVar107,auVar104);
  uVar152 = vcmpps_avx512vl(local_360,auVar107,2);
  uVar33 = vpcmpgtd_avx512vl(auVar93,_DAT_01fb4ba0);
  uVar84 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),(uint)(byte)((byte)uVar152 & (byte)uVar33));
  local_750 = pre->ray_space + k;
  auVar149 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_340 = vmovdqa64_avx512f(auVar149);
  local_748 = prim;
  for (; uVar84 != 0; uVar84 = (ulong)((uint)uVar84 & (uint)uVar84 + 0xff & (uint)uVar152)) {
    lVar79 = 0;
    for (uVar78 = uVar84; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x8000000000000000) {
      lVar79 = lVar79 + 1;
    }
    uVar12 = *(uint *)(local_748 + 2);
    pGVar14 = (context->scene->geometries).items[uVar12].ptr;
    uVar78 = (ulong)*(uint *)(*(long *)&pGVar14->field_0x58 +
                             (ulong)*(uint *)(local_748 + lVar79 * 4 + 6) *
                             pGVar14[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i);
    fVar151 = (pGVar14->time_range).lower;
    fVar151 = pGVar14->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0x1c0) - fVar151) / ((pGVar14->time_range).upper - fVar151)
              );
    auVar89 = vroundss_avx(ZEXT416((uint)fVar151),ZEXT416((uint)fVar151),9);
    auVar89 = vminss_avx(auVar89,ZEXT416((uint)(pGVar14->fnumTimeSegments + -1.0)));
    auVar89 = vmaxss_avx(ZEXT816(0) << 0x20,auVar89);
    fVar151 = fVar151 - auVar89._0_4_;
    _Var15 = pGVar14[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar81 = (long)(int)auVar89._0_4_ * 0x38;
    lVar79 = *(long *)(_Var15 + 0x10 + lVar81);
    lVar80 = *(long *)(_Var15 + 0x38 + lVar81);
    lVar16 = *(long *)(_Var15 + 0x48 + lVar81);
    auVar153._4_4_ = fVar151;
    auVar153._0_4_ = fVar151;
    auVar153._8_4_ = fVar151;
    auVar153._12_4_ = fVar151;
    pfVar4 = (float *)(lVar80 + uVar78 * lVar16);
    auVar184._0_4_ = fVar151 * *pfVar4;
    auVar184._4_4_ = fVar151 * pfVar4[1];
    auVar184._8_4_ = fVar151 * pfVar4[2];
    auVar184._12_4_ = fVar151 * pfVar4[3];
    pfVar4 = (float *)(lVar80 + (uVar78 + 1) * lVar16);
    auVar185._0_4_ = fVar151 * *pfVar4;
    auVar185._4_4_ = fVar151 * pfVar4[1];
    auVar185._8_4_ = fVar151 * pfVar4[2];
    auVar185._12_4_ = fVar151 * pfVar4[3];
    auVar89 = vmulps_avx512vl(auVar153,*(undefined1 (*) [16])(lVar80 + (uVar78 + 2) * lVar16));
    auVar88 = vmulps_avx512vl(auVar153,*(undefined1 (*) [16])(lVar80 + lVar16 * (uVar78 + 3)));
    lVar80 = *(long *)(_Var15 + lVar81);
    fVar151 = 1.0 - fVar151;
    auVar146._4_4_ = fVar151;
    auVar146._0_4_ = fVar151;
    auVar146._8_4_ = fVar151;
    auVar146._12_4_ = fVar151;
    local_7f0 = vfmadd231ps_fma(auVar184,auVar146,*(undefined1 (*) [16])(lVar80 + lVar79 * uVar78));
    local_800 = vfmadd231ps_fma(auVar185,auVar146,
                                *(undefined1 (*) [16])(lVar80 + lVar79 * (uVar78 + 1)));
    local_810 = vfmadd231ps_avx512vl
                          (auVar89,auVar146,*(undefined1 (*) [16])(lVar80 + lVar79 * (uVar78 + 2)));
    _local_6b0 = vfmadd231ps_avx512vl
                           (auVar88,auVar146,*(undefined1 (*) [16])(lVar80 + lVar79 * (uVar78 + 3)))
    ;
    iVar13 = (int)pGVar14[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar89 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                            0x1c);
    auVar89 = vinsertps_avx(auVar89,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
    auVar90 = vsubps_avx(local_7f0,auVar89);
    uVar145 = auVar90._0_4_;
    auVar156._4_4_ = uVar145;
    auVar156._0_4_ = uVar145;
    auVar156._8_4_ = uVar145;
    auVar156._12_4_ = uVar145;
    auVar88 = vshufps_avx(auVar90,auVar90,0x55);
    auVar90 = vshufps_avx(auVar90,auVar90,0xaa);
    aVar5 = (local_750->vx).field_0;
    aVar6 = (local_750->vy).field_0;
    fVar151 = (local_750->vz).field_0.m128[0];
    fVar159 = *(float *)((long)&(local_750->vz).field_0 + 4);
    fVar150 = *(float *)((long)&(local_750->vz).field_0 + 8);
    fVar179 = *(float *)((long)&(local_750->vz).field_0 + 0xc);
    auVar178._0_4_ = fVar151 * auVar90._0_4_;
    auVar178._4_4_ = fVar159 * auVar90._4_4_;
    auVar178._8_4_ = fVar150 * auVar90._8_4_;
    auVar178._12_4_ = fVar179 * auVar90._12_4_;
    auVar88 = vfmadd231ps_fma(auVar178,(undefined1  [16])aVar6,auVar88);
    auVar154 = vfmadd231ps_fma(auVar88,(undefined1  [16])aVar5,auVar156);
    auVar90 = vsubps_avx(local_800,auVar89);
    uVar145 = auVar90._0_4_;
    auVar157._4_4_ = uVar145;
    auVar157._0_4_ = uVar145;
    auVar157._8_4_ = uVar145;
    auVar157._12_4_ = uVar145;
    auVar88 = vshufps_avx(auVar90,auVar90,0x55);
    auVar90 = vshufps_avx(auVar90,auVar90,0xaa);
    auVar181._0_4_ = fVar151 * auVar90._0_4_;
    auVar181._4_4_ = fVar159 * auVar90._4_4_;
    auVar181._8_4_ = fVar150 * auVar90._8_4_;
    auVar181._12_4_ = fVar179 * auVar90._12_4_;
    auVar88 = vfmadd231ps_fma(auVar181,(undefined1  [16])aVar6,auVar88);
    auVar7 = vfmadd231ps_fma(auVar88,(undefined1  [16])aVar5,auVar157);
    auVar90 = vsubps_avx512vl(local_810,auVar89);
    uVar145 = auVar90._0_4_;
    auVar158._4_4_ = uVar145;
    auVar158._0_4_ = uVar145;
    auVar158._8_4_ = uVar145;
    auVar158._12_4_ = uVar145;
    auVar88 = vshufps_avx(auVar90,auVar90,0x55);
    auVar90 = vshufps_avx(auVar90,auVar90,0xaa);
    auVar183._0_4_ = fVar151 * auVar90._0_4_;
    auVar183._4_4_ = fVar159 * auVar90._4_4_;
    auVar183._8_4_ = fVar150 * auVar90._8_4_;
    auVar183._12_4_ = fVar179 * auVar90._12_4_;
    auVar88 = vfmadd231ps_fma(auVar183,(undefined1  [16])aVar6,auVar88);
    auVar8 = vfmadd231ps_fma(auVar88,(undefined1  [16])aVar5,auVar158);
    auVar88 = vsubps_avx512vl(_local_6b0,auVar89);
    uVar145 = auVar88._0_4_;
    auVar92._4_4_ = uVar145;
    auVar92._0_4_ = uVar145;
    auVar92._8_4_ = uVar145;
    auVar92._12_4_ = uVar145;
    auVar89 = vshufps_avx(auVar88,auVar88,0x55);
    auVar88 = vshufps_avx(auVar88,auVar88,0xaa);
    auVar186._0_4_ = fVar151 * auVar88._0_4_;
    auVar186._4_4_ = fVar159 * auVar88._4_4_;
    auVar186._8_4_ = fVar150 * auVar88._8_4_;
    auVar186._12_4_ = fVar179 * auVar88._12_4_;
    auVar89 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar6,auVar89);
    auVar9 = vfmadd231ps_fma(auVar89,(undefined1  [16])aVar5,auVar92);
    lVar79 = (long)iVar13 * 0x44;
    auVar107 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar79);
    local_6e0 = vbroadcastss_avx512vl(auVar154);
    auVar93._8_4_ = 1;
    auVar93._0_8_ = 0x100000001;
    auVar93._12_4_ = 1;
    auVar93._16_4_ = 1;
    auVar93._20_4_ = 1;
    auVar93._24_4_ = 1;
    auVar93._28_4_ = 1;
    local_700 = vpermps_avx2(auVar93,ZEXT1632(auVar154));
    auVar110 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar79 + 0x484);
    uVar145 = auVar7._0_4_;
    local_720._4_4_ = uVar145;
    local_720._0_4_ = uVar145;
    local_720._8_4_ = uVar145;
    local_720._12_4_ = uVar145;
    local_720._16_4_ = uVar145;
    local_720._20_4_ = uVar145;
    local_720._24_4_ = uVar145;
    local_720._28_4_ = uVar145;
    local_840 = vpermps_avx2(auVar93,ZEXT1632(auVar7));
    auVar109 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar79 + 0x908);
    local_860 = vbroadcastss_avx512vl(auVar8);
    local_7e0 = vpermps_avx512vl(auVar93,ZEXT1632(auVar8));
    auVar108 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar79 + 0xd8c);
    local_7a0 = vbroadcastss_avx512vl(auVar9);
    auVar195 = ZEXT3264(local_7a0);
    local_7c0 = vpermps_avx512vl(auVar93,ZEXT1632(auVar9));
    auVar196 = ZEXT3264(local_7c0);
    auVar104 = vmulps_avx512vl(local_7a0,auVar108);
    auVar105 = vmulps_avx512vl(local_7c0,auVar108);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar109,local_860);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar109,local_7e0);
    auVar89 = vfmadd231ps_fma(auVar104,auVar110,local_720);
    auVar88 = vfmadd231ps_fma(auVar105,auVar110,local_840);
    auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar89),auVar107,local_6e0);
    auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),auVar107,local_700);
    auVar104 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar79);
    auVar105 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar79 + 0x484);
    auVar106 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar79 + 0x908);
    auVar99 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar79 + 0xd8c);
    auVar112 = vmulps_avx512vl(local_7a0,auVar99);
    auVar113 = vmulps_avx512vl(local_7c0,auVar99);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar106,local_860);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar106,local_7e0);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar105,local_720);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar105,local_840);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar104,local_6e0);
    auVar10 = vfmadd231ps_fma(auVar113,auVar104,local_700);
    auVar113 = vsubps_avx512vl(auVar112,auVar100);
    auVar114 = vsubps_avx512vl(ZEXT1632(auVar10),auVar111);
    auVar93 = vmulps_avx512vl(auVar111,auVar113);
    auVar94 = vmulps_avx512vl(auVar100,auVar114);
    auVar93 = vsubps_avx512vl(auVar93,auVar94);
    auVar89 = vshufps_avx(local_7f0,local_7f0,0xff);
    uVar152 = auVar89._0_8_;
    local_380._8_8_ = uVar152;
    local_380._0_8_ = uVar152;
    local_380._16_8_ = uVar152;
    local_380._24_8_ = uVar152;
    auVar89 = vshufps_avx(local_800,local_800,0xff);
    local_3a0 = vbroadcastsd_avx512vl(auVar89);
    auVar89 = vshufps_avx512vl(local_810,local_810,0xff);
    local_3c0 = vbroadcastsd_avx512vl(auVar89);
    auVar89 = vshufps_avx512vl(_local_6b0,_local_6b0,0xff);
    uVar152 = auVar89._0_8_;
    register0x000012c8 = uVar152;
    local_3e0 = uVar152;
    register0x000012d0 = uVar152;
    register0x000012d8 = uVar152;
    auVar94 = vmulps_avx512vl(_local_3e0,auVar108);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar109,local_3c0);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar110,local_3a0);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar107,local_380);
    auVar95 = vmulps_avx512vl(_local_3e0,auVar99);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar106,local_3c0);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar105,local_3a0);
    auVar11 = vfmadd231ps_fma(auVar95,auVar104,local_380);
    auVar95 = vmulps_avx512vl(auVar114,auVar114);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar113,auVar113);
    auVar96 = vmaxps_avx512vl(auVar94,ZEXT1632(auVar11));
    auVar96 = vmulps_avx512vl(auVar96,auVar96);
    auVar95 = vmulps_avx512vl(auVar96,auVar95);
    auVar93 = vmulps_avx512vl(auVar93,auVar93);
    uVar152 = vcmpps_avx512vl(auVar93,auVar95,2);
    auVar89 = vblendps_avx(auVar154,local_7f0,8);
    auVar90 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar88 = vandps_avx512vl(auVar89,auVar90);
    auVar89 = vblendps_avx(auVar7,local_800,8);
    auVar89 = vandps_avx512vl(auVar89,auVar90);
    auVar88 = vmaxps_avx(auVar88,auVar89);
    auVar89 = vblendps_avx(auVar8,local_810,8);
    auVar91 = vandps_avx512vl(auVar89,auVar90);
    auVar89 = vblendps_avx(auVar9,_local_6b0,8);
    auVar89 = vandps_avx512vl(auVar89,auVar90);
    auVar89 = vmaxps_avx(auVar91,auVar89);
    auVar89 = vmaxps_avx(auVar88,auVar89);
    auVar88 = vmovshdup_avx(auVar89);
    auVar88 = vmaxss_avx(auVar88,auVar89);
    auVar89 = vshufpd_avx(auVar89,auVar89,1);
    auVar90 = vcvtsi2ss_avx512f(local_810,iVar13);
    auVar89 = vmaxss_avx(auVar89,auVar88);
    local_480._0_16_ = auVar90;
    fVar159 = auVar90._0_4_;
    auVar103._4_4_ = fVar159;
    auVar103._0_4_ = fVar159;
    auVar103._8_4_ = fVar159;
    auVar103._12_4_ = fVar159;
    auVar103._16_4_ = fVar159;
    auVar103._20_4_ = fVar159;
    auVar103._24_4_ = fVar159;
    auVar103._28_4_ = fVar159;
    uVar33 = vcmpps_avx512vl(auVar103,_DAT_01f7b060,0xe);
    bVar85 = (byte)uVar152 & (byte)uVar33;
    fVar151 = auVar89._0_4_ * 4.7683716e-07;
    auVar102._8_4_ = 2;
    auVar102._0_8_ = 0x200000002;
    auVar102._12_4_ = 2;
    auVar102._16_4_ = 2;
    auVar102._20_4_ = 2;
    auVar102._24_4_ = 2;
    auVar102._28_4_ = 2;
    local_400 = vpermps_avx512vl(auVar102,ZEXT1632(auVar154));
    local_420 = vpermps_avx512vl(auVar102,ZEXT1632(auVar7));
    local_440 = vpermps_avx512vl(auVar102,ZEXT1632(auVar8));
    local_780 = vpermps_avx2(auVar102,ZEXT1632(auVar9));
    auVar149 = vpbroadcastd_avx512f();
    local_300 = vmovdqa64_avx512f(auVar149);
    uVar180 = *(uint *)(ray + k * 4 + 0xc0);
    if (bVar85 == 0) {
      bVar82 = false;
      auVar89 = vxorps_avx512vl(auVar99._0_16_,auVar99._0_16_);
      auVar190 = ZEXT1664(auVar89);
      auVar191 = ZEXT3264(local_6e0);
      auVar192 = ZEXT3264(local_700);
      auVar193 = ZEXT3264(local_720);
      auVar107 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar197 = ZEXT3264(auVar107);
      auVar189 = ZEXT3264(local_840);
      auVar149 = ZEXT3264(local_860);
      auVar194 = ZEXT3264(local_7e0);
    }
    else {
      local_740._0_16_ = ZEXT416(uVar180);
      auVar99 = vmulps_avx512vl(local_780,auVar99);
      auVar106 = vfmadd213ps_avx512vl(auVar106,local_440,auVar99);
      auVar105 = vfmadd213ps_avx512vl(auVar105,local_420,auVar106);
      auVar105 = vfmadd213ps_avx512vl(auVar104,local_400,auVar105);
      auVar108 = vmulps_avx512vl(local_780,auVar108);
      auVar109 = vfmadd213ps_avx512vl(auVar109,local_440,auVar108);
      auVar106 = vfmadd213ps_avx512vl(auVar110,local_420,auVar109);
      auVar110 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar79 + 0x1210);
      auVar109 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar79 + 0x1694);
      auVar108 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar79 + 0x1b18);
      auVar104 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar79 + 0x1f9c);
      auVar106 = vfmadd213ps_avx512vl(auVar107,local_400,auVar106);
      auVar107 = vmulps_avx512vl(local_7a0,auVar104);
      auVar99 = vmulps_avx512vl(local_7c0,auVar104);
      auVar104 = vmulps_avx512vl(local_780,auVar104);
      auVar89 = vfmadd231ps_fma(auVar107,auVar108,local_860);
      auVar107 = vfmadd231ps_avx512vl(auVar99,auVar108,local_7e0);
      auVar108 = vfmadd231ps_avx512vl(auVar104,local_440,auVar108);
      auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar109,local_720);
      auVar189 = ZEXT3264(local_840);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar109,local_840);
      auVar104 = vfmadd231ps_avx512vl(auVar108,local_420,auVar109);
      auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar110,local_6e0);
      auVar99 = vfmadd231ps_avx512vl(auVar107,auVar110,local_700);
      auVar107 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar79 + 0x1210);
      auVar109 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar79 + 0x1b18);
      auVar108 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar79 + 0x1f9c);
      auVar104 = vfmadd231ps_avx512vl(auVar104,local_400,auVar110);
      auVar110 = vmulps_avx512vl(local_7a0,auVar108);
      auVar93 = vmulps_avx512vl(local_7c0,auVar108);
      auVar108 = vmulps_avx512vl(local_780,auVar108);
      auVar95 = vfmadd231ps_avx512vl(auVar110,auVar109,local_860);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar109,local_7e0);
      auVar109 = vfmadd231ps_avx512vl(auVar108,local_440,auVar109);
      auVar110 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar79 + 0x1694);
      auVar108 = vfmadd231ps_avx512vl(auVar95,auVar110,local_720);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar110,local_840);
      auVar110 = vfmadd231ps_avx512vl(auVar109,local_420,auVar110);
      auVar88 = vfmadd231ps_fma(auVar108,auVar107,local_6e0);
      auVar109 = vfmadd231ps_avx512vl(auVar93,auVar107,local_700);
      auVar108 = vfmadd231ps_avx512vl(auVar110,local_400,auVar107);
      auVar187._8_4_ = 0x7fffffff;
      auVar187._0_8_ = 0x7fffffff7fffffff;
      auVar187._12_4_ = 0x7fffffff;
      auVar187._16_4_ = 0x7fffffff;
      auVar187._20_4_ = 0x7fffffff;
      auVar187._24_4_ = 0x7fffffff;
      auVar187._28_4_ = 0x7fffffff;
      auVar107 = vandps_avx(ZEXT1632(auVar89),auVar187);
      auVar110 = vandps_avx(auVar99,auVar187);
      auVar110 = vmaxps_avx(auVar107,auVar110);
      auVar107 = vandps_avx(auVar104,auVar187);
      auVar107 = vmaxps_avx(auVar110,auVar107);
      auVar104 = vbroadcastss_avx512vl(ZEXT416((uint)fVar151));
      uVar78 = vcmpps_avx512vl(auVar107,auVar104,1);
      bVar82 = (bool)((byte)uVar78 & 1);
      auVar115._0_4_ = (float)((uint)bVar82 * auVar113._0_4_ | (uint)!bVar82 * auVar89._0_4_);
      bVar82 = (bool)((byte)(uVar78 >> 1) & 1);
      auVar115._4_4_ = (float)((uint)bVar82 * auVar113._4_4_ | (uint)!bVar82 * auVar89._4_4_);
      bVar82 = (bool)((byte)(uVar78 >> 2) & 1);
      auVar115._8_4_ = (float)((uint)bVar82 * auVar113._8_4_ | (uint)!bVar82 * auVar89._8_4_);
      bVar82 = (bool)((byte)(uVar78 >> 3) & 1);
      auVar115._12_4_ = (float)((uint)bVar82 * auVar113._12_4_ | (uint)!bVar82 * auVar89._12_4_);
      fVar179 = (float)((uint)((byte)(uVar78 >> 4) & 1) * auVar113._16_4_);
      auVar115._16_4_ = fVar179;
      fVar150 = (float)((uint)((byte)(uVar78 >> 5) & 1) * auVar113._20_4_);
      auVar115._20_4_ = fVar150;
      fVar174 = (float)((uint)((byte)(uVar78 >> 6) & 1) * auVar113._24_4_);
      auVar115._24_4_ = fVar174;
      uVar1 = (uint)(byte)(uVar78 >> 7) * auVar113._28_4_;
      auVar115._28_4_ = uVar1;
      bVar82 = (bool)((byte)uVar78 & 1);
      auVar116._0_4_ = (float)((uint)bVar82 * auVar114._0_4_ | (uint)!bVar82 * auVar99._0_4_);
      bVar82 = (bool)((byte)(uVar78 >> 1) & 1);
      auVar116._4_4_ = (float)((uint)bVar82 * auVar114._4_4_ | (uint)!bVar82 * auVar99._4_4_);
      bVar82 = (bool)((byte)(uVar78 >> 2) & 1);
      auVar116._8_4_ = (float)((uint)bVar82 * auVar114._8_4_ | (uint)!bVar82 * auVar99._8_4_);
      bVar82 = (bool)((byte)(uVar78 >> 3) & 1);
      auVar116._12_4_ = (float)((uint)bVar82 * auVar114._12_4_ | (uint)!bVar82 * auVar99._12_4_);
      bVar82 = (bool)((byte)(uVar78 >> 4) & 1);
      auVar116._16_4_ = (float)((uint)bVar82 * auVar114._16_4_ | (uint)!bVar82 * auVar99._16_4_);
      bVar82 = (bool)((byte)(uVar78 >> 5) & 1);
      auVar116._20_4_ = (float)((uint)bVar82 * auVar114._20_4_ | (uint)!bVar82 * auVar99._20_4_);
      bVar82 = (bool)((byte)(uVar78 >> 6) & 1);
      auVar116._24_4_ = (float)((uint)bVar82 * auVar114._24_4_ | (uint)!bVar82 * auVar99._24_4_);
      bVar82 = SUB81(uVar78 >> 7,0);
      auVar116._28_4_ = (uint)bVar82 * auVar114._28_4_ | (uint)!bVar82 * auVar99._28_4_;
      auVar107 = vandps_avx(auVar187,ZEXT1632(auVar88));
      auVar110 = vandps_avx(auVar109,auVar187);
      auVar110 = vmaxps_avx(auVar107,auVar110);
      auVar107 = vandps_avx(auVar108,auVar187);
      auVar107 = vmaxps_avx(auVar110,auVar107);
      uVar78 = vcmpps_avx512vl(auVar107,auVar104,1);
      bVar82 = (bool)((byte)uVar78 & 1);
      auVar117._0_4_ = (float)((uint)bVar82 * auVar113._0_4_ | (uint)!bVar82 * auVar88._0_4_);
      bVar82 = (bool)((byte)(uVar78 >> 1) & 1);
      auVar117._4_4_ = (float)((uint)bVar82 * auVar113._4_4_ | (uint)!bVar82 * auVar88._4_4_);
      bVar82 = (bool)((byte)(uVar78 >> 2) & 1);
      auVar117._8_4_ = (float)((uint)bVar82 * auVar113._8_4_ | (uint)!bVar82 * auVar88._8_4_);
      bVar82 = (bool)((byte)(uVar78 >> 3) & 1);
      auVar117._12_4_ = (float)((uint)bVar82 * auVar113._12_4_ | (uint)!bVar82 * auVar88._12_4_);
      fVar176 = (float)((uint)((byte)(uVar78 >> 4) & 1) * auVar113._16_4_);
      auVar117._16_4_ = fVar176;
      fVar173 = (float)((uint)((byte)(uVar78 >> 5) & 1) * auVar113._20_4_);
      auVar117._20_4_ = fVar173;
      fVar175 = (float)((uint)((byte)(uVar78 >> 6) & 1) * auVar113._24_4_);
      auVar117._24_4_ = fVar175;
      auVar117._28_4_ = (uint)(byte)(uVar78 >> 7) * auVar113._28_4_;
      bVar82 = (bool)((byte)uVar78 & 1);
      auVar118._0_4_ = (float)((uint)bVar82 * auVar114._0_4_ | (uint)!bVar82 * auVar109._0_4_);
      bVar82 = (bool)((byte)(uVar78 >> 1) & 1);
      auVar118._4_4_ = (float)((uint)bVar82 * auVar114._4_4_ | (uint)!bVar82 * auVar109._4_4_);
      bVar82 = (bool)((byte)(uVar78 >> 2) & 1);
      auVar118._8_4_ = (float)((uint)bVar82 * auVar114._8_4_ | (uint)!bVar82 * auVar109._8_4_);
      bVar82 = (bool)((byte)(uVar78 >> 3) & 1);
      auVar118._12_4_ = (float)((uint)bVar82 * auVar114._12_4_ | (uint)!bVar82 * auVar109._12_4_);
      bVar82 = (bool)((byte)(uVar78 >> 4) & 1);
      auVar118._16_4_ = (float)((uint)bVar82 * auVar114._16_4_ | (uint)!bVar82 * auVar109._16_4_);
      bVar82 = (bool)((byte)(uVar78 >> 5) & 1);
      auVar118._20_4_ = (float)((uint)bVar82 * auVar114._20_4_ | (uint)!bVar82 * auVar109._20_4_);
      bVar82 = (bool)((byte)(uVar78 >> 6) & 1);
      auVar118._24_4_ = (float)((uint)bVar82 * auVar114._24_4_ | (uint)!bVar82 * auVar109._24_4_);
      bVar82 = SUB81(uVar78 >> 7,0);
      auVar118._28_4_ = (uint)bVar82 * auVar114._28_4_ | (uint)!bVar82 * auVar109._28_4_;
      auVar92 = vxorps_avx512vl(local_860._0_16_,local_860._0_16_);
      auVar190 = ZEXT1664(auVar92);
      auVar107 = vfmadd213ps_avx512vl(auVar115,auVar115,ZEXT1632(auVar92));
      auVar89 = vfmadd231ps_fma(auVar107,auVar116,auVar116);
      auVar107 = vrsqrt14ps_avx512vl(ZEXT1632(auVar89));
      fVar86 = auVar107._0_4_;
      fVar87 = auVar107._4_4_;
      fVar138 = auVar107._8_4_;
      fVar139 = auVar107._12_4_;
      fVar140 = auVar107._16_4_;
      fVar141 = auVar107._20_4_;
      fVar142 = auVar107._24_4_;
      auVar41._4_4_ = fVar87 * fVar87 * fVar87 * auVar89._4_4_ * -0.5;
      auVar41._0_4_ = fVar86 * fVar86 * fVar86 * auVar89._0_4_ * -0.5;
      auVar41._8_4_ = fVar138 * fVar138 * fVar138 * auVar89._8_4_ * -0.5;
      auVar41._12_4_ = fVar139 * fVar139 * fVar139 * auVar89._12_4_ * -0.5;
      auVar41._16_4_ = fVar140 * fVar140 * fVar140 * -0.0;
      auVar41._20_4_ = fVar141 * fVar141 * fVar141 * -0.0;
      auVar41._24_4_ = fVar142 * fVar142 * fVar142 * -0.0;
      auVar41._28_4_ = 0;
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar109 = vfmadd231ps_avx512vl(auVar41,auVar110,auVar107);
      auVar42._4_4_ = auVar116._4_4_ * auVar109._4_4_;
      auVar42._0_4_ = auVar116._0_4_ * auVar109._0_4_;
      auVar42._8_4_ = auVar116._8_4_ * auVar109._8_4_;
      auVar42._12_4_ = auVar116._12_4_ * auVar109._12_4_;
      auVar42._16_4_ = auVar116._16_4_ * auVar109._16_4_;
      auVar42._20_4_ = auVar116._20_4_ * auVar109._20_4_;
      auVar42._24_4_ = auVar116._24_4_ * auVar109._24_4_;
      auVar42._28_4_ = auVar107._28_4_;
      auVar43._4_4_ = auVar109._4_4_ * -auVar115._4_4_;
      auVar43._0_4_ = auVar109._0_4_ * -auVar115._0_4_;
      auVar43._8_4_ = auVar109._8_4_ * -auVar115._8_4_;
      auVar43._12_4_ = auVar109._12_4_ * -auVar115._12_4_;
      auVar43._16_4_ = auVar109._16_4_ * -fVar179;
      auVar43._20_4_ = auVar109._20_4_ * -fVar150;
      auVar43._24_4_ = auVar109._24_4_ * -fVar174;
      auVar43._28_4_ = uVar1 ^ 0x80000000;
      auVar107 = vmulps_avx512vl(auVar109,ZEXT1632(auVar92));
      auVar113 = ZEXT1632(auVar92);
      auVar108 = vfmadd213ps_avx512vl(auVar117,auVar117,auVar113);
      auVar89 = vfmadd231ps_fma(auVar108,auVar118,auVar118);
      auVar108 = vrsqrt14ps_avx512vl(ZEXT1632(auVar89));
      fVar150 = auVar108._0_4_;
      fVar179 = auVar108._4_4_;
      fVar174 = auVar108._8_4_;
      fVar86 = auVar108._12_4_;
      fVar87 = auVar108._16_4_;
      fVar138 = auVar108._20_4_;
      fVar139 = auVar108._24_4_;
      auVar44._4_4_ = fVar179 * fVar179 * fVar179 * auVar89._4_4_ * -0.5;
      auVar44._0_4_ = fVar150 * fVar150 * fVar150 * auVar89._0_4_ * -0.5;
      auVar44._8_4_ = fVar174 * fVar174 * fVar174 * auVar89._8_4_ * -0.5;
      auVar44._12_4_ = fVar86 * fVar86 * fVar86 * auVar89._12_4_ * -0.5;
      auVar44._16_4_ = fVar87 * fVar87 * fVar87 * -0.0;
      auVar44._20_4_ = fVar138 * fVar138 * fVar138 * -0.0;
      auVar44._24_4_ = fVar139 * fVar139 * fVar139 * -0.0;
      auVar44._28_4_ = 0;
      auVar110 = vfmadd231ps_avx512vl(auVar44,auVar110,auVar108);
      auVar45._4_4_ = auVar118._4_4_ * auVar110._4_4_;
      auVar45._0_4_ = auVar118._0_4_ * auVar110._0_4_;
      auVar45._8_4_ = auVar118._8_4_ * auVar110._8_4_;
      auVar45._12_4_ = auVar118._12_4_ * auVar110._12_4_;
      auVar45._16_4_ = auVar118._16_4_ * auVar110._16_4_;
      auVar45._20_4_ = auVar118._20_4_ * auVar110._20_4_;
      auVar45._24_4_ = auVar118._24_4_ * auVar110._24_4_;
      auVar45._28_4_ = auVar108._28_4_;
      auVar46._4_4_ = -auVar117._4_4_ * auVar110._4_4_;
      auVar46._0_4_ = -auVar117._0_4_ * auVar110._0_4_;
      auVar46._8_4_ = -auVar117._8_4_ * auVar110._8_4_;
      auVar46._12_4_ = -auVar117._12_4_ * auVar110._12_4_;
      auVar46._16_4_ = -fVar176 * auVar110._16_4_;
      auVar46._20_4_ = -fVar173 * auVar110._20_4_;
      auVar46._24_4_ = -fVar175 * auVar110._24_4_;
      auVar46._28_4_ = auVar109._28_4_;
      auVar110 = vmulps_avx512vl(auVar110,auVar113);
      auVar89 = vfmadd213ps_fma(auVar42,auVar94,auVar100);
      auVar88 = vfmadd213ps_fma(auVar43,auVar94,auVar111);
      auVar109 = vfmadd213ps_avx512vl(auVar107,auVar94,auVar106);
      auVar108 = vfmadd213ps_avx512vl(auVar45,ZEXT1632(auVar11),auVar112);
      auVar9 = vfnmadd213ps_fma(auVar42,auVar94,auVar100);
      auVar99 = ZEXT1632(auVar11);
      auVar90 = vfmadd213ps_fma(auVar46,auVar99,ZEXT1632(auVar10));
      auVar91 = vfnmadd213ps_fma(auVar43,auVar94,auVar111);
      auVar154 = vfmadd213ps_fma(auVar110,auVar99,auVar105);
      auVar104 = vfnmadd231ps_avx512vl(auVar106,auVar94,auVar107);
      auVar146 = vfnmadd213ps_fma(auVar45,auVar99,auVar112);
      auVar10 = vfnmadd213ps_fma(auVar46,auVar99,ZEXT1632(auVar10));
      auVar153 = vfnmadd231ps_fma(auVar105,ZEXT1632(auVar11),auVar110);
      auVar110 = vsubps_avx512vl(auVar108,ZEXT1632(auVar9));
      auVar107 = vsubps_avx(ZEXT1632(auVar90),ZEXT1632(auVar91));
      auVar105 = vsubps_avx512vl(ZEXT1632(auVar154),auVar104);
      auVar106 = vmulps_avx512vl(auVar107,auVar104);
      auVar7 = vfmsub231ps_fma(auVar106,ZEXT1632(auVar91),auVar105);
      auVar47._4_4_ = auVar9._4_4_ * auVar105._4_4_;
      auVar47._0_4_ = auVar9._0_4_ * auVar105._0_4_;
      auVar47._8_4_ = auVar9._8_4_ * auVar105._8_4_;
      auVar47._12_4_ = auVar9._12_4_ * auVar105._12_4_;
      auVar47._16_4_ = auVar105._16_4_ * 0.0;
      auVar47._20_4_ = auVar105._20_4_ * 0.0;
      auVar47._24_4_ = auVar105._24_4_ * 0.0;
      auVar47._28_4_ = auVar105._28_4_;
      auVar105 = vfmsub231ps_avx512vl(auVar47,auVar104,auVar110);
      auVar48._4_4_ = auVar91._4_4_ * auVar110._4_4_;
      auVar48._0_4_ = auVar91._0_4_ * auVar110._0_4_;
      auVar48._8_4_ = auVar91._8_4_ * auVar110._8_4_;
      auVar48._12_4_ = auVar91._12_4_ * auVar110._12_4_;
      auVar48._16_4_ = auVar110._16_4_ * 0.0;
      auVar48._20_4_ = auVar110._20_4_ * 0.0;
      auVar48._24_4_ = auVar110._24_4_ * 0.0;
      auVar48._28_4_ = auVar110._28_4_;
      auVar8 = vfmsub231ps_fma(auVar48,ZEXT1632(auVar9),auVar107);
      auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar8),auVar113,auVar105);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar113,ZEXT1632(auVar7));
      auVar113 = ZEXT1632(auVar92);
      uVar78 = vcmpps_avx512vl(auVar107,auVar113,2);
      bVar77 = (byte)uVar78;
      fVar86 = (float)((uint)(bVar77 & 1) * auVar89._0_4_ |
                      (uint)!(bool)(bVar77 & 1) * auVar146._0_4_);
      bVar82 = (bool)((byte)(uVar78 >> 1) & 1);
      fVar138 = (float)((uint)bVar82 * auVar89._4_4_ | (uint)!bVar82 * auVar146._4_4_);
      bVar82 = (bool)((byte)(uVar78 >> 2) & 1);
      fVar140 = (float)((uint)bVar82 * auVar89._8_4_ | (uint)!bVar82 * auVar146._8_4_);
      bVar82 = (bool)((byte)(uVar78 >> 3) & 1);
      fVar142 = (float)((uint)bVar82 * auVar89._12_4_ | (uint)!bVar82 * auVar146._12_4_);
      auVar106 = ZEXT1632(CONCAT412(fVar142,CONCAT48(fVar140,CONCAT44(fVar138,fVar86))));
      fVar87 = (float)((uint)(bVar77 & 1) * auVar88._0_4_ |
                      (uint)!(bool)(bVar77 & 1) * auVar10._0_4_);
      bVar82 = (bool)((byte)(uVar78 >> 1) & 1);
      fVar139 = (float)((uint)bVar82 * auVar88._4_4_ | (uint)!bVar82 * auVar10._4_4_);
      bVar82 = (bool)((byte)(uVar78 >> 2) & 1);
      fVar141 = (float)((uint)bVar82 * auVar88._8_4_ | (uint)!bVar82 * auVar10._8_4_);
      bVar82 = (bool)((byte)(uVar78 >> 3) & 1);
      fVar143 = (float)((uint)bVar82 * auVar88._12_4_ | (uint)!bVar82 * auVar10._12_4_);
      auVar99 = ZEXT1632(CONCAT412(fVar143,CONCAT48(fVar141,CONCAT44(fVar139,fVar87))));
      auVar119._0_4_ =
           (float)((uint)(bVar77 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar153._0_4_)
      ;
      bVar82 = (bool)((byte)(uVar78 >> 1) & 1);
      auVar119._4_4_ = (float)((uint)bVar82 * auVar109._4_4_ | (uint)!bVar82 * auVar153._4_4_);
      bVar82 = (bool)((byte)(uVar78 >> 2) & 1);
      auVar119._8_4_ = (float)((uint)bVar82 * auVar109._8_4_ | (uint)!bVar82 * auVar153._8_4_);
      bVar82 = (bool)((byte)(uVar78 >> 3) & 1);
      auVar119._12_4_ = (float)((uint)bVar82 * auVar109._12_4_ | (uint)!bVar82 * auVar153._12_4_);
      fVar174 = (float)((uint)((byte)(uVar78 >> 4) & 1) * auVar109._16_4_);
      auVar119._16_4_ = fVar174;
      fVar179 = (float)((uint)((byte)(uVar78 >> 5) & 1) * auVar109._20_4_);
      auVar119._20_4_ = fVar179;
      fVar150 = (float)((uint)((byte)(uVar78 >> 6) & 1) * auVar109._24_4_);
      auVar119._24_4_ = fVar150;
      iVar2 = (uint)(byte)(uVar78 >> 7) * auVar109._28_4_;
      auVar119._28_4_ = iVar2;
      auVar110 = vblendmps_avx512vl(ZEXT1632(auVar9),auVar108);
      auVar120._0_4_ =
           (uint)(bVar77 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar88._0_4_;
      bVar82 = (bool)((byte)(uVar78 >> 1) & 1);
      auVar120._4_4_ = (uint)bVar82 * auVar110._4_4_ | (uint)!bVar82 * auVar88._4_4_;
      bVar82 = (bool)((byte)(uVar78 >> 2) & 1);
      auVar120._8_4_ = (uint)bVar82 * auVar110._8_4_ | (uint)!bVar82 * auVar88._8_4_;
      bVar82 = (bool)((byte)(uVar78 >> 3) & 1);
      auVar120._12_4_ = (uint)bVar82 * auVar110._12_4_ | (uint)!bVar82 * auVar88._12_4_;
      auVar120._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * auVar110._16_4_;
      auVar120._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * auVar110._20_4_;
      auVar120._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * auVar110._24_4_;
      auVar120._28_4_ = (uint)(byte)(uVar78 >> 7) * auVar110._28_4_;
      auVar110 = vblendmps_avx512vl(ZEXT1632(auVar91),ZEXT1632(auVar90));
      auVar121._0_4_ =
           (float)((uint)(bVar77 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar7._0_4_);
      bVar82 = (bool)((byte)(uVar78 >> 1) & 1);
      auVar121._4_4_ = (float)((uint)bVar82 * auVar110._4_4_ | (uint)!bVar82 * auVar7._4_4_);
      bVar82 = (bool)((byte)(uVar78 >> 2) & 1);
      auVar121._8_4_ = (float)((uint)bVar82 * auVar110._8_4_ | (uint)!bVar82 * auVar7._8_4_);
      bVar82 = (bool)((byte)(uVar78 >> 3) & 1);
      auVar121._12_4_ = (float)((uint)bVar82 * auVar110._12_4_ | (uint)!bVar82 * auVar7._12_4_);
      fVar176 = (float)((uint)((byte)(uVar78 >> 4) & 1) * auVar110._16_4_);
      auVar121._16_4_ = fVar176;
      fVar173 = (float)((uint)((byte)(uVar78 >> 5) & 1) * auVar110._20_4_);
      auVar121._20_4_ = fVar173;
      fVar175 = (float)((uint)((byte)(uVar78 >> 6) & 1) * auVar110._24_4_);
      auVar121._24_4_ = fVar175;
      auVar121._28_4_ = (uint)(byte)(uVar78 >> 7) * auVar110._28_4_;
      auVar110 = vblendmps_avx512vl(auVar104,ZEXT1632(auVar154));
      auVar122._0_4_ =
           (float)((uint)(bVar77 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar109._0_4_)
      ;
      bVar82 = (bool)((byte)(uVar78 >> 1) & 1);
      auVar122._4_4_ = (float)((uint)bVar82 * auVar110._4_4_ | (uint)!bVar82 * auVar109._4_4_);
      bVar82 = (bool)((byte)(uVar78 >> 2) & 1);
      auVar122._8_4_ = (float)((uint)bVar82 * auVar110._8_4_ | (uint)!bVar82 * auVar109._8_4_);
      bVar82 = (bool)((byte)(uVar78 >> 3) & 1);
      auVar122._12_4_ = (float)((uint)bVar82 * auVar110._12_4_ | (uint)!bVar82 * auVar109._12_4_);
      bVar82 = (bool)((byte)(uVar78 >> 4) & 1);
      auVar122._16_4_ = (float)((uint)bVar82 * auVar110._16_4_ | (uint)!bVar82 * auVar109._16_4_);
      bVar82 = (bool)((byte)(uVar78 >> 5) & 1);
      auVar122._20_4_ = (float)((uint)bVar82 * auVar110._20_4_ | (uint)!bVar82 * auVar109._20_4_);
      bVar82 = (bool)((byte)(uVar78 >> 6) & 1);
      auVar122._24_4_ = (float)((uint)bVar82 * auVar110._24_4_ | (uint)!bVar82 * auVar109._24_4_);
      bVar82 = SUB81(uVar78 >> 7,0);
      auVar122._28_4_ = (uint)bVar82 * auVar110._28_4_ | (uint)!bVar82 * auVar109._28_4_;
      auVar123._0_4_ =
           (uint)(bVar77 & 1) * (int)auVar9._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar108._0_4_;
      bVar82 = (bool)((byte)(uVar78 >> 1) & 1);
      auVar123._4_4_ = (uint)bVar82 * (int)auVar9._4_4_ | (uint)!bVar82 * auVar108._4_4_;
      bVar82 = (bool)((byte)(uVar78 >> 2) & 1);
      auVar123._8_4_ = (uint)bVar82 * (int)auVar9._8_4_ | (uint)!bVar82 * auVar108._8_4_;
      bVar82 = (bool)((byte)(uVar78 >> 3) & 1);
      auVar123._12_4_ = (uint)bVar82 * (int)auVar9._12_4_ | (uint)!bVar82 * auVar108._12_4_;
      auVar123._16_4_ = (uint)!(bool)((byte)(uVar78 >> 4) & 1) * auVar108._16_4_;
      auVar123._20_4_ = (uint)!(bool)((byte)(uVar78 >> 5) & 1) * auVar108._20_4_;
      auVar123._24_4_ = (uint)!(bool)((byte)(uVar78 >> 6) & 1) * auVar108._24_4_;
      auVar123._28_4_ = (uint)!SUB81(uVar78 >> 7,0) * auVar108._28_4_;
      bVar82 = (bool)((byte)(uVar78 >> 1) & 1);
      bVar19 = (bool)((byte)(uVar78 >> 2) & 1);
      bVar20 = (bool)((byte)(uVar78 >> 3) & 1);
      auVar124._0_4_ =
           (uint)(bVar77 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar154._0_4_;
      bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
      auVar124._4_4_ = (uint)bVar18 * auVar104._4_4_ | (uint)!bVar18 * auVar154._4_4_;
      bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
      auVar124._8_4_ = (uint)bVar18 * auVar104._8_4_ | (uint)!bVar18 * auVar154._8_4_;
      bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
      auVar124._12_4_ = (uint)bVar18 * auVar104._12_4_ | (uint)!bVar18 * auVar154._12_4_;
      auVar124._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * auVar104._16_4_;
      auVar124._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * auVar104._20_4_;
      auVar124._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * auVar104._24_4_;
      iVar3 = (uint)(byte)(uVar78 >> 7) * auVar104._28_4_;
      auVar124._28_4_ = iVar3;
      auVar100 = vsubps_avx512vl(auVar123,auVar106);
      auVar110 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar91._12_4_ |
                                               (uint)!bVar20 * auVar90._12_4_,
                                               CONCAT48((uint)bVar19 * (int)auVar91._8_4_ |
                                                        (uint)!bVar19 * auVar90._8_4_,
                                                        CONCAT44((uint)bVar82 * (int)auVar91._4_4_ |
                                                                 (uint)!bVar82 * auVar90._4_4_,
                                                                 (uint)(bVar77 & 1) *
                                                                 (int)auVar91._0_4_ |
                                                                 (uint)!(bool)(bVar77 & 1) *
                                                                 auVar90._0_4_)))),auVar99);
      auVar109 = vsubps_avx(auVar124,auVar119);
      auVar108 = vsubps_avx(auVar106,auVar120);
      auVar104 = vsubps_avx(auVar99,auVar121);
      auVar105 = vsubps_avx(auVar119,auVar122);
      auVar49._4_4_ = auVar109._4_4_ * fVar138;
      auVar49._0_4_ = auVar109._0_4_ * fVar86;
      auVar49._8_4_ = auVar109._8_4_ * fVar140;
      auVar49._12_4_ = auVar109._12_4_ * fVar142;
      auVar49._16_4_ = auVar109._16_4_ * 0.0;
      auVar49._20_4_ = auVar109._20_4_ * 0.0;
      auVar49._24_4_ = auVar109._24_4_ * 0.0;
      auVar49._28_4_ = iVar3;
      auVar89 = vfmsub231ps_fma(auVar49,auVar119,auVar100);
      auVar50._4_4_ = fVar139 * auVar100._4_4_;
      auVar50._0_4_ = fVar87 * auVar100._0_4_;
      auVar50._8_4_ = fVar141 * auVar100._8_4_;
      auVar50._12_4_ = fVar143 * auVar100._12_4_;
      auVar50._16_4_ = auVar100._16_4_ * 0.0;
      auVar50._20_4_ = auVar100._20_4_ * 0.0;
      auVar50._24_4_ = auVar100._24_4_ * 0.0;
      auVar50._28_4_ = auVar107._28_4_;
      auVar88 = vfmsub231ps_fma(auVar50,auVar106,auVar110);
      auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),auVar113,ZEXT1632(auVar89));
      auVar167._0_4_ = auVar110._0_4_ * auVar119._0_4_;
      auVar167._4_4_ = auVar110._4_4_ * auVar119._4_4_;
      auVar167._8_4_ = auVar110._8_4_ * auVar119._8_4_;
      auVar167._12_4_ = auVar110._12_4_ * auVar119._12_4_;
      auVar167._16_4_ = auVar110._16_4_ * fVar174;
      auVar167._20_4_ = auVar110._20_4_ * fVar179;
      auVar167._24_4_ = auVar110._24_4_ * fVar150;
      auVar167._28_4_ = 0;
      auVar89 = vfmsub231ps_fma(auVar167,auVar99,auVar109);
      auVar111 = vfmadd231ps_avx512vl(auVar107,auVar113,ZEXT1632(auVar89));
      auVar107 = vmulps_avx512vl(auVar105,auVar120);
      auVar107 = vfmsub231ps_avx512vl(auVar107,auVar108,auVar122);
      auVar51._4_4_ = auVar104._4_4_ * auVar122._4_4_;
      auVar51._0_4_ = auVar104._0_4_ * auVar122._0_4_;
      auVar51._8_4_ = auVar104._8_4_ * auVar122._8_4_;
      auVar51._12_4_ = auVar104._12_4_ * auVar122._12_4_;
      auVar51._16_4_ = auVar104._16_4_ * auVar122._16_4_;
      auVar51._20_4_ = auVar104._20_4_ * auVar122._20_4_;
      auVar51._24_4_ = auVar104._24_4_ * auVar122._24_4_;
      auVar51._28_4_ = auVar122._28_4_;
      auVar89 = vfmsub231ps_fma(auVar51,auVar121,auVar105);
      auVar168._0_4_ = auVar121._0_4_ * auVar108._0_4_;
      auVar168._4_4_ = auVar121._4_4_ * auVar108._4_4_;
      auVar168._8_4_ = auVar121._8_4_ * auVar108._8_4_;
      auVar168._12_4_ = auVar121._12_4_ * auVar108._12_4_;
      auVar168._16_4_ = fVar176 * auVar108._16_4_;
      auVar168._20_4_ = fVar173 * auVar108._20_4_;
      auVar168._24_4_ = fVar175 * auVar108._24_4_;
      auVar168._28_4_ = 0;
      auVar88 = vfmsub231ps_fma(auVar168,auVar104,auVar120);
      auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),auVar113,auVar107);
      auVar112 = vfmadd231ps_avx512vl(auVar107,auVar113,ZEXT1632(auVar89));
      auVar107 = vmaxps_avx(auVar111,auVar112);
      uVar152 = vcmpps_avx512vl(auVar107,auVar113,2);
      bVar85 = bVar85 & (byte)uVar152;
      auVar191 = ZEXT3264(local_6e0);
      auVar192 = ZEXT3264(local_700);
      auVar193 = ZEXT3264(local_720);
      auVar149 = ZEXT3264(local_860);
      if (bVar85 == 0) {
        bVar82 = false;
        auVar107 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar197 = ZEXT3264(auVar107);
        auVar194 = ZEXT3264(local_7e0);
        auVar195 = ZEXT3264(local_7a0);
        auVar196 = ZEXT3264(local_7c0);
      }
      else {
        auVar52._4_4_ = auVar105._4_4_ * auVar110._4_4_;
        auVar52._0_4_ = auVar105._0_4_ * auVar110._0_4_;
        auVar52._8_4_ = auVar105._8_4_ * auVar110._8_4_;
        auVar52._12_4_ = auVar105._12_4_ * auVar110._12_4_;
        auVar52._16_4_ = auVar105._16_4_ * auVar110._16_4_;
        auVar52._20_4_ = auVar105._20_4_ * auVar110._20_4_;
        auVar52._24_4_ = auVar105._24_4_ * auVar110._24_4_;
        auVar52._28_4_ = auVar107._28_4_;
        auVar90 = vfmsub231ps_fma(auVar52,auVar104,auVar109);
        auVar53._4_4_ = auVar109._4_4_ * auVar108._4_4_;
        auVar53._0_4_ = auVar109._0_4_ * auVar108._0_4_;
        auVar53._8_4_ = auVar109._8_4_ * auVar108._8_4_;
        auVar53._12_4_ = auVar109._12_4_ * auVar108._12_4_;
        auVar53._16_4_ = auVar109._16_4_ * auVar108._16_4_;
        auVar53._20_4_ = auVar109._20_4_ * auVar108._20_4_;
        auVar53._24_4_ = auVar109._24_4_ * auVar108._24_4_;
        auVar53._28_4_ = auVar109._28_4_;
        auVar88 = vfmsub231ps_fma(auVar53,auVar100,auVar105);
        auVar54._4_4_ = auVar104._4_4_ * auVar100._4_4_;
        auVar54._0_4_ = auVar104._0_4_ * auVar100._0_4_;
        auVar54._8_4_ = auVar104._8_4_ * auVar100._8_4_;
        auVar54._12_4_ = auVar104._12_4_ * auVar100._12_4_;
        auVar54._16_4_ = auVar104._16_4_ * auVar100._16_4_;
        auVar54._20_4_ = auVar104._20_4_ * auVar100._20_4_;
        auVar54._24_4_ = auVar104._24_4_ * auVar100._24_4_;
        auVar54._28_4_ = auVar104._28_4_;
        auVar154 = vfmsub231ps_fma(auVar54,auVar108,auVar110);
        auVar89 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar88),ZEXT1632(auVar154));
        auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar89),ZEXT1632(auVar90),auVar113);
        auVar110 = vrcp14ps_avx512vl(auVar107);
        auVar109 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar197 = ZEXT3264(auVar109);
        auVar108 = vfnmadd213ps_avx512vl(auVar110,auVar107,auVar109);
        auVar89 = vfmadd132ps_fma(auVar108,auVar110,auVar110);
        auVar55._4_4_ = auVar154._4_4_ * auVar119._4_4_;
        auVar55._0_4_ = auVar154._0_4_ * auVar119._0_4_;
        auVar55._8_4_ = auVar154._8_4_ * auVar119._8_4_;
        auVar55._12_4_ = auVar154._12_4_ * auVar119._12_4_;
        auVar55._16_4_ = fVar174 * 0.0;
        auVar55._20_4_ = fVar179 * 0.0;
        auVar55._24_4_ = fVar150 * 0.0;
        auVar55._28_4_ = iVar2;
        auVar88 = vfmadd231ps_fma(auVar55,auVar99,ZEXT1632(auVar88));
        auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar106,ZEXT1632(auVar90));
        fVar150 = auVar89._0_4_;
        fVar179 = auVar89._4_4_;
        fVar174 = auVar89._8_4_;
        fVar176 = auVar89._12_4_;
        local_5a0 = ZEXT1632(CONCAT412(auVar88._12_4_ * fVar176,
                                       CONCAT48(auVar88._8_4_ * fVar174,
                                                CONCAT44(auVar88._4_4_ * fVar179,
                                                         auVar88._0_4_ * fVar150))));
        auVar177._4_4_ = uVar180;
        auVar177._0_4_ = uVar180;
        auVar177._8_4_ = uVar180;
        auVar177._12_4_ = uVar180;
        auVar177._16_4_ = uVar180;
        auVar177._20_4_ = uVar180;
        auVar177._24_4_ = uVar180;
        auVar177._28_4_ = uVar180;
        uVar152 = vcmpps_avx512vl(auVar177,local_5a0,2);
        uVar145 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar35._4_4_ = uVar145;
        auVar35._0_4_ = uVar145;
        auVar35._8_4_ = uVar145;
        auVar35._12_4_ = uVar145;
        auVar35._16_4_ = uVar145;
        auVar35._20_4_ = uVar145;
        auVar35._24_4_ = uVar145;
        auVar35._28_4_ = uVar145;
        uVar33 = vcmpps_avx512vl(local_5a0,auVar35,2);
        bVar85 = (byte)uVar152 & (byte)uVar33 & bVar85;
        auVar195 = ZEXT3264(local_7a0);
        auVar196 = ZEXT3264(local_7c0);
        if (bVar85 == 0) {
          bVar82 = false;
          auVar194 = ZEXT3264(local_7e0);
        }
        else {
          uVar152 = vcmpps_avx512vl(auVar107,auVar113,4);
          bVar85 = bVar85 & (byte)uVar152;
          auVar194 = ZEXT3264(local_7e0);
          if (bVar85 != 0) {
            fVar173 = auVar111._0_4_ * fVar150;
            fVar175 = auVar111._4_4_ * fVar179;
            auVar56._4_4_ = fVar175;
            auVar56._0_4_ = fVar173;
            fVar86 = auVar111._8_4_ * fVar174;
            auVar56._8_4_ = fVar86;
            fVar87 = auVar111._12_4_ * fVar176;
            auVar56._12_4_ = fVar87;
            fVar138 = auVar111._16_4_ * 0.0;
            auVar56._16_4_ = fVar138;
            fVar139 = auVar111._20_4_ * 0.0;
            auVar56._20_4_ = fVar139;
            fVar140 = auVar111._24_4_ * 0.0;
            auVar56._24_4_ = fVar140;
            auVar56._28_4_ = auVar107._28_4_;
            auVar110 = vsubps_avx512vl(auVar109,auVar56);
            local_5e0._0_4_ =
                 (float)((uint)(bVar77 & 1) * (int)fVar173 |
                        (uint)!(bool)(bVar77 & 1) * auVar110._0_4_);
            bVar82 = (bool)((byte)(uVar78 >> 1) & 1);
            local_5e0._4_4_ = (float)((uint)bVar82 * (int)fVar175 | (uint)!bVar82 * auVar110._4_4_);
            bVar82 = (bool)((byte)(uVar78 >> 2) & 1);
            local_5e0._8_4_ = (float)((uint)bVar82 * (int)fVar86 | (uint)!bVar82 * auVar110._8_4_);
            bVar82 = (bool)((byte)(uVar78 >> 3) & 1);
            local_5e0._12_4_ = (float)((uint)bVar82 * (int)fVar87 | (uint)!bVar82 * auVar110._12_4_)
            ;
            bVar82 = (bool)((byte)(uVar78 >> 4) & 1);
            local_5e0._16_4_ =
                 (float)((uint)bVar82 * (int)fVar138 | (uint)!bVar82 * auVar110._16_4_);
            bVar82 = (bool)((byte)(uVar78 >> 5) & 1);
            local_5e0._20_4_ =
                 (float)((uint)bVar82 * (int)fVar139 | (uint)!bVar82 * auVar110._20_4_);
            bVar82 = (bool)((byte)(uVar78 >> 6) & 1);
            local_5e0._24_4_ =
                 (float)((uint)bVar82 * (int)fVar140 | (uint)!bVar82 * auVar110._24_4_);
            bVar82 = SUB81(uVar78 >> 7,0);
            local_5e0._28_4_ =
                 (float)((uint)bVar82 * auVar107._28_4_ | (uint)!bVar82 * auVar110._28_4_);
            auVar107 = vsubps_avx(ZEXT1632(auVar11),auVar94);
            auVar89 = vfmadd213ps_fma(auVar107,local_5e0,auVar94);
            uVar145 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
            auVar94._4_4_ = uVar145;
            auVar94._0_4_ = uVar145;
            auVar94._8_4_ = uVar145;
            auVar94._12_4_ = uVar145;
            auVar94._16_4_ = uVar145;
            auVar94._20_4_ = uVar145;
            auVar94._24_4_ = uVar145;
            auVar94._28_4_ = uVar145;
            auVar107 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar89._12_4_ + auVar89._12_4_,
                                                          CONCAT48(auVar89._8_4_ + auVar89._8_4_,
                                                                   CONCAT44(auVar89._4_4_ +
                                                                            auVar89._4_4_,
                                                                            auVar89._0_4_ +
                                                                            auVar89._0_4_)))),
                                       auVar94);
            uVar152 = vcmpps_avx512vl(local_5a0,auVar107,6);
            if (((byte)uVar152 & bVar85) != 0) {
              auVar164._0_4_ = auVar112._0_4_ * fVar150;
              auVar164._4_4_ = auVar112._4_4_ * fVar179;
              auVar164._8_4_ = auVar112._8_4_ * fVar174;
              auVar164._12_4_ = auVar112._12_4_ * fVar176;
              auVar164._16_4_ = auVar112._16_4_ * 0.0;
              auVar164._20_4_ = auVar112._20_4_ * 0.0;
              auVar164._24_4_ = auVar112._24_4_ * 0.0;
              auVar164._28_4_ = 0;
              auVar107 = vsubps_avx512vl(auVar109,auVar164);
              auVar125._0_4_ =
                   (uint)(bVar77 & 1) * (int)auVar164._0_4_ |
                   (uint)!(bool)(bVar77 & 1) * auVar107._0_4_;
              bVar82 = (bool)((byte)(uVar78 >> 1) & 1);
              auVar125._4_4_ = (uint)bVar82 * (int)auVar164._4_4_ | (uint)!bVar82 * auVar107._4_4_;
              bVar82 = (bool)((byte)(uVar78 >> 2) & 1);
              auVar125._8_4_ = (uint)bVar82 * (int)auVar164._8_4_ | (uint)!bVar82 * auVar107._8_4_;
              bVar82 = (bool)((byte)(uVar78 >> 3) & 1);
              auVar125._12_4_ =
                   (uint)bVar82 * (int)auVar164._12_4_ | (uint)!bVar82 * auVar107._12_4_;
              bVar82 = (bool)((byte)(uVar78 >> 4) & 1);
              auVar125._16_4_ =
                   (uint)bVar82 * (int)auVar164._16_4_ | (uint)!bVar82 * auVar107._16_4_;
              bVar82 = (bool)((byte)(uVar78 >> 5) & 1);
              auVar125._20_4_ =
                   (uint)bVar82 * (int)auVar164._20_4_ | (uint)!bVar82 * auVar107._20_4_;
              bVar82 = (bool)((byte)(uVar78 >> 6) & 1);
              auVar125._24_4_ =
                   (uint)bVar82 * (int)auVar164._24_4_ | (uint)!bVar82 * auVar107._24_4_;
              auVar125._28_4_ = (uint)!SUB81(uVar78 >> 7,0) * auVar107._28_4_;
              auVar36._8_4_ = 0x40000000;
              auVar36._0_8_ = 0x4000000040000000;
              auVar36._12_4_ = 0x40000000;
              auVar36._16_4_ = 0x40000000;
              auVar36._20_4_ = 0x40000000;
              auVar36._24_4_ = 0x40000000;
              auVar36._28_4_ = 0x40000000;
              local_5c0 = vfmsub132ps_avx512vl(auVar125,auVar109,auVar36);
              local_580 = 0;
              local_570 = local_7f0._0_8_;
              uStack_568 = local_7f0._8_8_;
              local_560 = local_800._0_8_;
              uStack_558 = local_800._8_8_;
              local_550 = local_810._0_8_;
              uStack_548 = local_810._8_8_;
              if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (bVar82 = true, pGVar14->occlusionFilterN == (RTCFilterFunctionN)0x0))
                goto LAB_01bb8122;
                fVar159 = 1.0 / fVar159;
                local_520[0] = fVar159 * (local_5e0._0_4_ + 0.0);
                local_520[1] = fVar159 * (local_5e0._4_4_ + 1.0);
                local_520[2] = fVar159 * (local_5e0._8_4_ + 2.0);
                local_520[3] = fVar159 * (local_5e0._12_4_ + 3.0);
                fStack_510 = fVar159 * (local_5e0._16_4_ + 4.0);
                fStack_50c = fVar159 * (local_5e0._20_4_ + 5.0);
                fStack_508 = fVar159 * (local_5e0._24_4_ + 6.0);
                fStack_504 = local_5e0._28_4_ + 7.0;
                local_500 = local_5c0;
                local_4e0 = local_5a0;
                uVar78 = 0;
                uVar83 = (ulong)((byte)uVar152 & bVar85);
                for (uVar34 = uVar83; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000)
                {
                  uVar78 = uVar78 + 1;
                }
                auVar136 = vpbroadcastd_avx512f();
                local_4c0 = vmovdqa64_avx512f(auVar136);
                local_57c = iVar13;
                while (auVar89 = auVar190._0_16_, uVar83 != 0) {
                  uVar145 = *(undefined4 *)(ray + k * 4 + 0x200);
                  local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_520[uVar78]));
                  local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_500 + uVar78 * 4)));
                  *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_4e0 + uVar78 * 4);
                  local_890.context = context->user;
                  fVar150 = local_200._0_4_;
                  fVar159 = 1.0 - fVar150;
                  auVar7 = vfnmadd231ss_fma(ZEXT416((uint)(fVar150 * (fVar159 + fVar159))),
                                            ZEXT416((uint)fVar159),ZEXT416((uint)fVar159));
                  auVar154 = local_200._0_16_;
                  auVar88 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar154,
                                            ZEXT416(0xc0a00000));
                  auVar90 = vfmadd231ss_fma(ZEXT416((uint)(fVar150 * fVar150 * 3.0)),
                                            ZEXT416((uint)(fVar150 + fVar150)),auVar88);
                  auVar88 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar154,
                                            ZEXT416(0x40000000));
                  auVar88 = vfmadd231ss_fma(ZEXT416((uint)(fVar159 * fVar159 * -3.0)),
                                            ZEXT416((uint)(fVar159 + fVar159)),auVar88);
                  auVar154 = vfmadd231ss_fma(ZEXT416((uint)(fVar150 * fVar150)),auVar154,
                                             ZEXT416((uint)(fVar159 * -2.0)));
                  fVar159 = auVar7._0_4_ * 0.5;
                  fVar150 = auVar90._0_4_ * 0.5;
                  fVar179 = auVar88._0_4_ * 0.5;
                  fVar174 = auVar154._0_4_ * 0.5;
                  auVar160._0_4_ = fVar174 * (float)local_6b0._0_4_;
                  auVar160._4_4_ = fVar174 * (float)local_6b0._4_4_;
                  auVar160._8_4_ = fVar174 * fStack_6a8;
                  auVar160._12_4_ = fVar174 * fStack_6a4;
                  auVar171._4_4_ = fVar179;
                  auVar171._0_4_ = fVar179;
                  auVar171._8_4_ = fVar179;
                  auVar171._12_4_ = fVar179;
                  auVar88 = vfmadd132ps_fma(auVar171,auVar160,local_810);
                  auVar161._4_4_ = fVar150;
                  auVar161._0_4_ = fVar150;
                  auVar161._8_4_ = fVar150;
                  auVar161._12_4_ = fVar150;
                  auVar88 = vfmadd132ps_fma(auVar161,auVar88,local_800);
                  auVar147._4_4_ = fVar159;
                  auVar147._0_4_ = fVar159;
                  auVar147._8_4_ = fVar159;
                  auVar147._12_4_ = fVar159;
                  auVar88 = vfmadd132ps_fma(auVar147,auVar88,local_7f0);
                  auVar136 = vbroadcastss_avx512f(auVar88);
                  auVar137 = vbroadcastss_avx512f(ZEXT416(1));
                  local_280 = vpermps_avx512f(auVar137,ZEXT1664(auVar88));
                  auVar137 = vbroadcastss_avx512f(ZEXT416(2));
                  local_240 = vpermps_avx512f(auVar137,ZEXT1664(auVar88));
                  local_2c0[0] = (RTCHitN)auVar136[0];
                  local_2c0[1] = (RTCHitN)auVar136[1];
                  local_2c0[2] = (RTCHitN)auVar136[2];
                  local_2c0[3] = (RTCHitN)auVar136[3];
                  local_2c0[4] = (RTCHitN)auVar136[4];
                  local_2c0[5] = (RTCHitN)auVar136[5];
                  local_2c0[6] = (RTCHitN)auVar136[6];
                  local_2c0[7] = (RTCHitN)auVar136[7];
                  local_2c0[8] = (RTCHitN)auVar136[8];
                  local_2c0[9] = (RTCHitN)auVar136[9];
                  local_2c0[10] = (RTCHitN)auVar136[10];
                  local_2c0[0xb] = (RTCHitN)auVar136[0xb];
                  local_2c0[0xc] = (RTCHitN)auVar136[0xc];
                  local_2c0[0xd] = (RTCHitN)auVar136[0xd];
                  local_2c0[0xe] = (RTCHitN)auVar136[0xe];
                  local_2c0[0xf] = (RTCHitN)auVar136[0xf];
                  local_2c0[0x10] = (RTCHitN)auVar136[0x10];
                  local_2c0[0x11] = (RTCHitN)auVar136[0x11];
                  local_2c0[0x12] = (RTCHitN)auVar136[0x12];
                  local_2c0[0x13] = (RTCHitN)auVar136[0x13];
                  local_2c0[0x14] = (RTCHitN)auVar136[0x14];
                  local_2c0[0x15] = (RTCHitN)auVar136[0x15];
                  local_2c0[0x16] = (RTCHitN)auVar136[0x16];
                  local_2c0[0x17] = (RTCHitN)auVar136[0x17];
                  local_2c0[0x18] = (RTCHitN)auVar136[0x18];
                  local_2c0[0x19] = (RTCHitN)auVar136[0x19];
                  local_2c0[0x1a] = (RTCHitN)auVar136[0x1a];
                  local_2c0[0x1b] = (RTCHitN)auVar136[0x1b];
                  local_2c0[0x1c] = (RTCHitN)auVar136[0x1c];
                  local_2c0[0x1d] = (RTCHitN)auVar136[0x1d];
                  local_2c0[0x1e] = (RTCHitN)auVar136[0x1e];
                  local_2c0[0x1f] = (RTCHitN)auVar136[0x1f];
                  local_2c0[0x20] = (RTCHitN)auVar136[0x20];
                  local_2c0[0x21] = (RTCHitN)auVar136[0x21];
                  local_2c0[0x22] = (RTCHitN)auVar136[0x22];
                  local_2c0[0x23] = (RTCHitN)auVar136[0x23];
                  local_2c0[0x24] = (RTCHitN)auVar136[0x24];
                  local_2c0[0x25] = (RTCHitN)auVar136[0x25];
                  local_2c0[0x26] = (RTCHitN)auVar136[0x26];
                  local_2c0[0x27] = (RTCHitN)auVar136[0x27];
                  local_2c0[0x28] = (RTCHitN)auVar136[0x28];
                  local_2c0[0x29] = (RTCHitN)auVar136[0x29];
                  local_2c0[0x2a] = (RTCHitN)auVar136[0x2a];
                  local_2c0[0x2b] = (RTCHitN)auVar136[0x2b];
                  local_2c0[0x2c] = (RTCHitN)auVar136[0x2c];
                  local_2c0[0x2d] = (RTCHitN)auVar136[0x2d];
                  local_2c0[0x2e] = (RTCHitN)auVar136[0x2e];
                  local_2c0[0x2f] = (RTCHitN)auVar136[0x2f];
                  local_2c0[0x30] = (RTCHitN)auVar136[0x30];
                  local_2c0[0x31] = (RTCHitN)auVar136[0x31];
                  local_2c0[0x32] = (RTCHitN)auVar136[0x32];
                  local_2c0[0x33] = (RTCHitN)auVar136[0x33];
                  local_2c0[0x34] = (RTCHitN)auVar136[0x34];
                  local_2c0[0x35] = (RTCHitN)auVar136[0x35];
                  local_2c0[0x36] = (RTCHitN)auVar136[0x36];
                  local_2c0[0x37] = (RTCHitN)auVar136[0x37];
                  local_2c0[0x38] = (RTCHitN)auVar136[0x38];
                  local_2c0[0x39] = (RTCHitN)auVar136[0x39];
                  local_2c0[0x3a] = (RTCHitN)auVar136[0x3a];
                  local_2c0[0x3b] = (RTCHitN)auVar136[0x3b];
                  local_2c0[0x3c] = (RTCHitN)auVar136[0x3c];
                  local_2c0[0x3d] = (RTCHitN)auVar136[0x3d];
                  local_2c0[0x3e] = (RTCHitN)auVar136[0x3e];
                  local_2c0[0x3f] = (RTCHitN)auVar136[0x3f];
                  local_180 = local_300._0_8_;
                  uStack_178 = local_300._8_8_;
                  uStack_170 = local_300._16_8_;
                  uStack_168 = local_300._24_8_;
                  uStack_160 = local_300._32_8_;
                  uStack_158 = local_300._40_8_;
                  uStack_150 = local_300._48_8_;
                  uStack_148 = local_300._56_8_;
                  auVar136 = vmovdqa64_avx512f(local_4c0);
                  local_140 = vmovdqa64_avx512f(auVar136);
                  vpcmpeqd_avx2(auVar136._0_32_,auVar136._0_32_);
                  local_100 = vbroadcastss_avx512f(ZEXT416((local_890.context)->instID[0]));
                  local_c0 = vbroadcastss_avx512f(ZEXT416((local_890.context)->instPrimID[0]));
                  auVar136 = vmovdqa64_avx512f(local_340);
                  local_640 = vmovdqa64_avx512f(auVar136);
                  local_890.valid = (int *)local_640;
                  local_890.geometryUserPtr = pGVar14->userPtr;
                  local_890.hit = local_2c0;
                  local_890.N = 0x10;
                  local_660 = (float)uVar83;
                  fStack_65c = (float)(uVar83 >> 0x20);
                  local_680 = (uint)uVar78;
                  uStack_67c = (uint)(uVar78 >> 0x20);
                  local_6a0._0_4_ = uVar145;
                  local_890.ray = (RTCRayN *)ray;
                  if (pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar14->occlusionFilterN)(&local_890);
                    uVar78 = CONCAT44(uStack_67c,local_680);
                    uVar83 = CONCAT44(fStack_65c,local_660);
                    auVar196 = ZEXT3264(local_7c0);
                    auVar195 = ZEXT3264(local_7a0);
                    auVar194 = ZEXT3264(local_7e0);
                    auVar149 = ZEXT3264(local_860);
                    auVar189 = ZEXT3264(local_840);
                    auVar193 = ZEXT3264(local_720);
                    auVar192 = ZEXT3264(local_700);
                    auVar191 = ZEXT3264(local_6e0);
                    auVar89 = vxorps_avx512vl(auVar89,auVar89);
                    auVar190 = ZEXT1664(auVar89);
                    auVar107 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar197 = ZEXT3264(auVar107);
                    auVar136 = vmovdqa64_avx512f(local_640);
                    uVar145 = local_6a0._0_4_;
                    uVar180 = local_740._0_4_;
                  }
                  auVar89 = auVar190._0_16_;
                  uVar152 = vptestmd_avx512f(auVar136,auVar136);
                  if ((short)uVar152 != 0) {
                    p_Var17 = context->args->filter;
                    if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar14->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var17)(&local_890);
                      uVar78 = CONCAT44(uStack_67c,local_680);
                      uVar83 = CONCAT44(fStack_65c,local_660);
                      auVar196 = ZEXT3264(local_7c0);
                      auVar195 = ZEXT3264(local_7a0);
                      auVar194 = ZEXT3264(local_7e0);
                      auVar149 = ZEXT3264(local_860);
                      auVar189 = ZEXT3264(local_840);
                      auVar193 = ZEXT3264(local_720);
                      auVar192 = ZEXT3264(local_700);
                      auVar191 = ZEXT3264(local_6e0);
                      auVar89 = vxorps_avx512vl(auVar89,auVar89);
                      auVar190 = ZEXT1664(auVar89);
                      auVar107 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar197 = ZEXT3264(auVar107);
                      auVar136 = vmovdqa64_avx512f(local_640);
                      uVar180 = local_740._0_4_;
                      uVar145 = local_6a0._0_4_;
                    }
                    uVar34 = vptestmd_avx512f(auVar136,auVar136);
                    auVar136 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                    bVar82 = (bool)((byte)uVar34 & 1);
                    bVar18 = (bool)((byte)(uVar34 >> 1) & 1);
                    bVar19 = (bool)((byte)(uVar34 >> 2) & 1);
                    bVar20 = (bool)((byte)(uVar34 >> 3) & 1);
                    bVar21 = (bool)((byte)(uVar34 >> 4) & 1);
                    bVar22 = (bool)((byte)(uVar34 >> 5) & 1);
                    bVar23 = (bool)((byte)(uVar34 >> 6) & 1);
                    bVar24 = (bool)((byte)(uVar34 >> 7) & 1);
                    bVar25 = (bool)((byte)(uVar34 >> 8) & 1);
                    bVar26 = (bool)((byte)(uVar34 >> 9) & 1);
                    bVar27 = (bool)((byte)(uVar34 >> 10) & 1);
                    bVar28 = (bool)((byte)(uVar34 >> 0xb) & 1);
                    bVar29 = (bool)((byte)(uVar34 >> 0xc) & 1);
                    bVar30 = (bool)((byte)(uVar34 >> 0xd) & 1);
                    bVar31 = (bool)((byte)(uVar34 >> 0xe) & 1);
                    bVar32 = SUB81(uVar34 >> 0xf,0);
                    *(uint *)(local_890.ray + 0x200) =
                         (uint)bVar82 * auVar136._0_4_ |
                         (uint)!bVar82 * *(int *)(local_890.ray + 0x200);
                    *(uint *)(local_890.ray + 0x204) =
                         (uint)bVar18 * auVar136._4_4_ |
                         (uint)!bVar18 * *(int *)(local_890.ray + 0x204);
                    *(uint *)(local_890.ray + 0x208) =
                         (uint)bVar19 * auVar136._8_4_ |
                         (uint)!bVar19 * *(int *)(local_890.ray + 0x208);
                    *(uint *)(local_890.ray + 0x20c) =
                         (uint)bVar20 * auVar136._12_4_ |
                         (uint)!bVar20 * *(int *)(local_890.ray + 0x20c);
                    *(uint *)(local_890.ray + 0x210) =
                         (uint)bVar21 * auVar136._16_4_ |
                         (uint)!bVar21 * *(int *)(local_890.ray + 0x210);
                    *(uint *)(local_890.ray + 0x214) =
                         (uint)bVar22 * auVar136._20_4_ |
                         (uint)!bVar22 * *(int *)(local_890.ray + 0x214);
                    *(uint *)(local_890.ray + 0x218) =
                         (uint)bVar23 * auVar136._24_4_ |
                         (uint)!bVar23 * *(int *)(local_890.ray + 0x218);
                    *(uint *)(local_890.ray + 0x21c) =
                         (uint)bVar24 * auVar136._28_4_ |
                         (uint)!bVar24 * *(int *)(local_890.ray + 0x21c);
                    *(uint *)(local_890.ray + 0x220) =
                         (uint)bVar25 * auVar136._32_4_ |
                         (uint)!bVar25 * *(int *)(local_890.ray + 0x220);
                    *(uint *)(local_890.ray + 0x224) =
                         (uint)bVar26 * auVar136._36_4_ |
                         (uint)!bVar26 * *(int *)(local_890.ray + 0x224);
                    *(uint *)(local_890.ray + 0x228) =
                         (uint)bVar27 * auVar136._40_4_ |
                         (uint)!bVar27 * *(int *)(local_890.ray + 0x228);
                    *(uint *)(local_890.ray + 0x22c) =
                         (uint)bVar28 * auVar136._44_4_ |
                         (uint)!bVar28 * *(int *)(local_890.ray + 0x22c);
                    *(uint *)(local_890.ray + 0x230) =
                         (uint)bVar29 * auVar136._48_4_ |
                         (uint)!bVar29 * *(int *)(local_890.ray + 0x230);
                    *(uint *)(local_890.ray + 0x234) =
                         (uint)bVar30 * auVar136._52_4_ |
                         (uint)!bVar30 * *(int *)(local_890.ray + 0x234);
                    *(uint *)(local_890.ray + 0x238) =
                         (uint)bVar31 * auVar136._56_4_ |
                         (uint)!bVar31 * *(int *)(local_890.ray + 0x238);
                    *(uint *)(local_890.ray + 0x23c) =
                         (uint)bVar32 * auVar136._60_4_ |
                         (uint)!bVar32 * *(int *)(local_890.ray + 0x23c);
                    if ((short)uVar34 != 0) {
                      bVar82 = true;
                      goto LAB_01bb8122;
                    }
                  }
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar145;
                  uVar34 = uVar78 & 0x3f;
                  uVar78 = 0;
                  uVar83 = uVar83 ^ 1L << uVar34;
                  for (uVar34 = uVar83; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000
                      ) {
                    uVar78 = uVar78 + 1;
                  }
                }
              }
            }
          }
          bVar82 = false;
        }
      }
    }
LAB_01bb8122:
    if (8 < iVar13) {
      local_740 = vpbroadcastd_avx512vl();
      local_6a0._0_4_ = 1.0 / (float)local_480._0_4_;
      local_6a0._4_4_ = local_6a0._0_4_;
      fStack_698 = (float)local_6a0._0_4_;
      fStack_694 = (float)local_6a0._0_4_;
      fStack_690 = (float)local_6a0._0_4_;
      fStack_68c = (float)local_6a0._0_4_;
      fStack_688 = (float)local_6a0._0_4_;
      register0x0000121c = local_6a0._0_4_;
      auVar136 = vpbroadcastd_avx512f();
      local_480 = vmovdqa64_avx512f(auVar136);
      local_680 = uVar180;
      uStack_67c = uVar180;
      uStack_678 = uVar180;
      uStack_674 = uVar180;
      uStack_670 = uVar180;
      uStack_66c = uVar180;
      uStack_668 = uVar180;
      uStack_664 = uVar180;
      local_660 = fVar151;
      fStack_65c = fVar151;
      fStack_658 = fVar151;
      fStack_654 = fVar151;
      fStack_650 = fVar151;
      fStack_64c = fVar151;
      fStack_648 = fVar151;
      fStack_644 = fVar151;
      for (lVar80 = 8; lVar80 < iVar13; lVar80 = lVar80 + 8) {
        auVar107 = vpbroadcastd_avx512vl();
        auVar104 = vpor_avx2(auVar107,_DAT_01fb4ba0);
        uVar33 = vpcmpd_avx512vl(auVar104,local_740,1);
        auVar107 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar80 * 4 + lVar79);
        auVar110 = *(undefined1 (*) [32])(lVar79 + 0x22047f0 + lVar80 * 4);
        auVar109 = *(undefined1 (*) [32])(lVar79 + 0x2204c74 + lVar80 * 4);
        auVar108 = *(undefined1 (*) [32])(lVar79 + 0x22050f8 + lVar80 * 4);
        local_7a0 = auVar195._0_32_;
        auVar105 = vmulps_avx512vl(local_7a0,auVar108);
        local_7c0 = auVar196._0_32_;
        auVar106 = vmulps_avx512vl(local_7c0,auVar108);
        auVar57._4_4_ = auVar108._4_4_ * (float)local_3e0._4_4_;
        auVar57._0_4_ = auVar108._0_4_ * (float)local_3e0._0_4_;
        auVar57._8_4_ = auVar108._8_4_ * fStack_3d8;
        auVar57._12_4_ = auVar108._12_4_ * fStack_3d4;
        auVar57._16_4_ = auVar108._16_4_ * fStack_3d0;
        auVar57._20_4_ = auVar108._20_4_ * fStack_3cc;
        auVar57._24_4_ = auVar108._24_4_ * fStack_3c8;
        auVar57._28_4_ = auVar104._28_4_;
        auVar97 = auVar149._0_32_;
        auVar104 = vfmadd231ps_avx512vl(auVar105,auVar109,auVar97);
        local_7e0 = auVar194._0_32_;
        auVar105 = vfmadd231ps_avx512vl(auVar106,auVar109,local_7e0);
        auVar106 = vfmadd231ps_avx512vl(auVar57,auVar109,local_3c0);
        auVar102 = auVar193._0_32_;
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar110,auVar102);
        auVar98 = auVar189._0_32_;
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar110,auVar98);
        auVar89 = vfmadd231ps_fma(auVar106,auVar110,local_3a0);
        local_6e0 = auVar191._0_32_;
        auVar112 = vfmadd231ps_avx512vl(auVar104,auVar107,local_6e0);
        auVar101 = auVar192._0_32_;
        auVar113 = vfmadd231ps_avx512vl(auVar105,auVar107,auVar101);
        auVar104 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar80 * 4 + lVar79);
        auVar105 = *(undefined1 (*) [32])(lVar79 + 0x2206c10 + lVar80 * 4);
        auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar107,local_380);
        auVar106 = *(undefined1 (*) [32])(lVar79 + 0x2207094 + lVar80 * 4);
        auVar99 = *(undefined1 (*) [32])(lVar79 + 0x2207518 + lVar80 * 4);
        auVar100 = vmulps_avx512vl(local_7a0,auVar99);
        auVar111 = vmulps_avx512vl(local_7c0,auVar99);
        auVar58._4_4_ = auVar99._4_4_ * (float)local_3e0._4_4_;
        auVar58._0_4_ = auVar99._0_4_ * (float)local_3e0._0_4_;
        auVar58._8_4_ = auVar99._8_4_ * fStack_3d8;
        auVar58._12_4_ = auVar99._12_4_ * fStack_3d4;
        auVar58._16_4_ = auVar99._16_4_ * fStack_3d0;
        auVar58._20_4_ = auVar99._20_4_ * fStack_3cc;
        auVar58._24_4_ = auVar99._24_4_ * fStack_3c8;
        auVar58._28_4_ = uStack_3c4;
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar106,auVar97);
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar106,local_7e0);
        auVar114 = vfmadd231ps_avx512vl(auVar58,auVar106,local_3c0);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar105,auVar102);
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar105,auVar98);
        auVar88 = vfmadd231ps_fma(auVar114,auVar105,local_3a0);
        auVar114 = vfmadd231ps_avx512vl(auVar100,auVar104,local_6e0);
        auVar93 = vfmadd231ps_avx512vl(auVar111,auVar104,auVar101);
        auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar104,local_380);
        auVar94 = vmaxps_avx512vl(ZEXT1632(auVar89),ZEXT1632(auVar88));
        auVar100 = vsubps_avx(auVar114,auVar112);
        auVar111 = vsubps_avx(auVar93,auVar113);
        auVar95 = vmulps_avx512vl(auVar113,auVar100);
        auVar96 = vmulps_avx512vl(auVar112,auVar111);
        auVar95 = vsubps_avx512vl(auVar95,auVar96);
        auVar96 = vmulps_avx512vl(auVar111,auVar111);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar100,auVar100);
        auVar94 = vmulps_avx512vl(auVar94,auVar94);
        auVar94 = vmulps_avx512vl(auVar94,auVar96);
        auVar95 = vmulps_avx512vl(auVar95,auVar95);
        uVar152 = vcmpps_avx512vl(auVar95,auVar94,2);
        bVar85 = (byte)uVar33 & (byte)uVar152;
        if (bVar85 == 0) {
          auVar189 = ZEXT3264(auVar98);
          auVar149 = ZEXT3264(auVar97);
        }
        else {
          auVar99 = vmulps_avx512vl(local_780,auVar99);
          auVar106 = vfmadd213ps_avx512vl(auVar106,local_440,auVar99);
          auVar105 = vfmadd213ps_avx512vl(auVar105,local_420,auVar106);
          auVar104 = vfmadd213ps_avx512vl(auVar104,local_400,auVar105);
          auVar108 = vmulps_avx512vl(local_780,auVar108);
          auVar109 = vfmadd213ps_avx512vl(auVar109,local_440,auVar108);
          auVar110 = vfmadd213ps_avx512vl(auVar110,local_420,auVar109);
          auVar105 = vfmadd213ps_avx512vl(auVar107,local_400,auVar110);
          auVar107 = *(undefined1 (*) [32])(lVar79 + 0x220557c + lVar80 * 4);
          auVar110 = *(undefined1 (*) [32])(lVar79 + 0x2205a00 + lVar80 * 4);
          auVar109 = *(undefined1 (*) [32])(lVar79 + 0x2205e84 + lVar80 * 4);
          auVar108 = *(undefined1 (*) [32])(lVar79 + 0x2206308 + lVar80 * 4);
          auVar106 = vmulps_avx512vl(local_7a0,auVar108);
          auVar99 = vmulps_avx512vl(local_7c0,auVar108);
          auVar108 = vmulps_avx512vl(local_780,auVar108);
          auVar106 = vfmadd231ps_avx512vl(auVar106,auVar109,auVar97);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar109,local_7e0);
          auVar109 = vfmadd231ps_avx512vl(auVar108,local_440,auVar109);
          auVar108 = vfmadd231ps_avx512vl(auVar106,auVar110,auVar102);
          auVar106 = vfmadd231ps_avx512vl(auVar99,auVar110,auVar98);
          auVar110 = vfmadd231ps_avx512vl(auVar109,local_420,auVar110);
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar107,local_6e0);
          auVar106 = vfmadd231ps_avx512vl(auVar106,auVar107,auVar101);
          auVar99 = vfmadd231ps_avx512vl(auVar110,local_400,auVar107);
          auVar107 = *(undefined1 (*) [32])(lVar79 + 0x220799c + lVar80 * 4);
          auVar110 = *(undefined1 (*) [32])(lVar79 + 0x22082a4 + lVar80 * 4);
          auVar109 = *(undefined1 (*) [32])(lVar79 + 0x2208728 + lVar80 * 4);
          auVar94 = vmulps_avx512vl(local_7a0,auVar109);
          auVar95 = vmulps_avx512vl(local_7c0,auVar109);
          auVar109 = vmulps_avx512vl(local_780,auVar109);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar110,auVar97);
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar110,local_7e0);
          auVar109 = vfmadd231ps_avx512vl(auVar109,local_440,auVar110);
          auVar110 = *(undefined1 (*) [32])(lVar79 + 0x2207e20 + lVar80 * 4);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar110,auVar102);
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar110,auVar98);
          auVar110 = vfmadd231ps_avx512vl(auVar109,local_420,auVar110);
          auVar109 = vfmadd231ps_avx512vl(auVar94,auVar107,local_6e0);
          auVar94 = vfmadd231ps_avx512vl(auVar95,auVar107,auVar101);
          auVar110 = vfmadd231ps_avx512vl(auVar110,local_400,auVar107);
          auVar95 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar108,auVar95);
          vandps_avx512vl(auVar106,auVar95);
          auVar107 = vmaxps_avx(auVar95,auVar95);
          vandps_avx512vl(auVar99,auVar95);
          auVar107 = vmaxps_avx(auVar107,auVar95);
          auVar76._4_4_ = fStack_65c;
          auVar76._0_4_ = local_660;
          auVar76._8_4_ = fStack_658;
          auVar76._12_4_ = fStack_654;
          auVar76._16_4_ = fStack_650;
          auVar76._20_4_ = fStack_64c;
          auVar76._24_4_ = fStack_648;
          auVar76._28_4_ = fStack_644;
          uVar78 = vcmpps_avx512vl(auVar107,auVar76,1);
          bVar18 = (bool)((byte)uVar78 & 1);
          auVar126._0_4_ = (float)((uint)bVar18 * auVar100._0_4_ | (uint)!bVar18 * auVar108._0_4_);
          bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar126._4_4_ = (float)((uint)bVar18 * auVar100._4_4_ | (uint)!bVar18 * auVar108._4_4_);
          bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar126._8_4_ = (float)((uint)bVar18 * auVar100._8_4_ | (uint)!bVar18 * auVar108._8_4_);
          bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar126._12_4_ =
               (float)((uint)bVar18 * auVar100._12_4_ | (uint)!bVar18 * auVar108._12_4_);
          bVar18 = (bool)((byte)(uVar78 >> 4) & 1);
          auVar126._16_4_ =
               (float)((uint)bVar18 * auVar100._16_4_ | (uint)!bVar18 * auVar108._16_4_);
          bVar18 = (bool)((byte)(uVar78 >> 5) & 1);
          auVar126._20_4_ =
               (float)((uint)bVar18 * auVar100._20_4_ | (uint)!bVar18 * auVar108._20_4_);
          bVar18 = (bool)((byte)(uVar78 >> 6) & 1);
          auVar126._24_4_ =
               (float)((uint)bVar18 * auVar100._24_4_ | (uint)!bVar18 * auVar108._24_4_);
          bVar18 = SUB81(uVar78 >> 7,0);
          auVar126._28_4_ = (uint)bVar18 * auVar100._28_4_ | (uint)!bVar18 * auVar108._28_4_;
          bVar18 = (bool)((byte)uVar78 & 1);
          auVar127._0_4_ = (float)((uint)bVar18 * auVar111._0_4_ | (uint)!bVar18 * auVar106._0_4_);
          bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar127._4_4_ = (float)((uint)bVar18 * auVar111._4_4_ | (uint)!bVar18 * auVar106._4_4_);
          bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar127._8_4_ = (float)((uint)bVar18 * auVar111._8_4_ | (uint)!bVar18 * auVar106._8_4_);
          bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar127._12_4_ =
               (float)((uint)bVar18 * auVar111._12_4_ | (uint)!bVar18 * auVar106._12_4_);
          bVar18 = (bool)((byte)(uVar78 >> 4) & 1);
          auVar127._16_4_ =
               (float)((uint)bVar18 * auVar111._16_4_ | (uint)!bVar18 * auVar106._16_4_);
          bVar18 = (bool)((byte)(uVar78 >> 5) & 1);
          auVar127._20_4_ =
               (float)((uint)bVar18 * auVar111._20_4_ | (uint)!bVar18 * auVar106._20_4_);
          bVar18 = (bool)((byte)(uVar78 >> 6) & 1);
          auVar127._24_4_ =
               (float)((uint)bVar18 * auVar111._24_4_ | (uint)!bVar18 * auVar106._24_4_);
          bVar18 = SUB81(uVar78 >> 7,0);
          auVar127._28_4_ = (uint)bVar18 * auVar111._28_4_ | (uint)!bVar18 * auVar106._28_4_;
          vandps_avx512vl(auVar109,auVar95);
          vandps_avx512vl(auVar94,auVar95);
          auVar107 = vmaxps_avx(auVar127,auVar127);
          vandps_avx512vl(auVar110,auVar95);
          auVar107 = vmaxps_avx(auVar107,auVar127);
          uVar78 = vcmpps_avx512vl(auVar107,auVar76,1);
          bVar18 = (bool)((byte)uVar78 & 1);
          auVar128._0_4_ = (uint)bVar18 * auVar100._0_4_ | (uint)!bVar18 * auVar109._0_4_;
          bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar128._4_4_ = (uint)bVar18 * auVar100._4_4_ | (uint)!bVar18 * auVar109._4_4_;
          bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar128._8_4_ = (uint)bVar18 * auVar100._8_4_ | (uint)!bVar18 * auVar109._8_4_;
          bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar128._12_4_ = (uint)bVar18 * auVar100._12_4_ | (uint)!bVar18 * auVar109._12_4_;
          bVar18 = (bool)((byte)(uVar78 >> 4) & 1);
          auVar128._16_4_ = (uint)bVar18 * auVar100._16_4_ | (uint)!bVar18 * auVar109._16_4_;
          bVar18 = (bool)((byte)(uVar78 >> 5) & 1);
          auVar128._20_4_ = (uint)bVar18 * auVar100._20_4_ | (uint)!bVar18 * auVar109._20_4_;
          bVar18 = (bool)((byte)(uVar78 >> 6) & 1);
          auVar128._24_4_ = (uint)bVar18 * auVar100._24_4_ | (uint)!bVar18 * auVar109._24_4_;
          bVar18 = SUB81(uVar78 >> 7,0);
          auVar128._28_4_ = (uint)bVar18 * auVar100._28_4_ | (uint)!bVar18 * auVar109._28_4_;
          bVar18 = (bool)((byte)uVar78 & 1);
          auVar129._0_4_ = (float)((uint)bVar18 * auVar111._0_4_ | (uint)!bVar18 * auVar94._0_4_);
          bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar129._4_4_ = (float)((uint)bVar18 * auVar111._4_4_ | (uint)!bVar18 * auVar94._4_4_);
          bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar129._8_4_ = (float)((uint)bVar18 * auVar111._8_4_ | (uint)!bVar18 * auVar94._8_4_);
          bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar129._12_4_ = (float)((uint)bVar18 * auVar111._12_4_ | (uint)!bVar18 * auVar94._12_4_)
          ;
          bVar18 = (bool)((byte)(uVar78 >> 4) & 1);
          auVar129._16_4_ = (float)((uint)bVar18 * auVar111._16_4_ | (uint)!bVar18 * auVar94._16_4_)
          ;
          bVar18 = (bool)((byte)(uVar78 >> 5) & 1);
          auVar129._20_4_ = (float)((uint)bVar18 * auVar111._20_4_ | (uint)!bVar18 * auVar94._20_4_)
          ;
          bVar18 = (bool)((byte)(uVar78 >> 6) & 1);
          auVar129._24_4_ = (float)((uint)bVar18 * auVar111._24_4_ | (uint)!bVar18 * auVar94._24_4_)
          ;
          bVar18 = SUB81(uVar78 >> 7,0);
          auVar129._28_4_ = (uint)bVar18 * auVar111._28_4_ | (uint)!bVar18 * auVar94._28_4_;
          auVar182._8_4_ = 0x80000000;
          auVar182._0_8_ = 0x8000000080000000;
          auVar182._12_4_ = 0x80000000;
          auVar182._16_4_ = 0x80000000;
          auVar182._20_4_ = 0x80000000;
          auVar182._24_4_ = 0x80000000;
          auVar182._28_4_ = 0x80000000;
          auVar107 = vxorps_avx512vl(auVar128,auVar182);
          auVar94 = auVar190._0_32_;
          auVar110 = vfmadd213ps_avx512vl(auVar126,auVar126,auVar94);
          auVar90 = vfmadd231ps_fma(auVar110,auVar127,auVar127);
          auVar110 = vrsqrt14ps_avx512vl(ZEXT1632(auVar90));
          auVar188._8_4_ = 0xbf000000;
          auVar188._0_8_ = 0xbf000000bf000000;
          auVar188._12_4_ = 0xbf000000;
          auVar188._16_4_ = 0xbf000000;
          auVar188._20_4_ = 0xbf000000;
          auVar188._24_4_ = 0xbf000000;
          auVar188._28_4_ = 0xbf000000;
          fVar151 = auVar110._0_4_;
          fVar159 = auVar110._4_4_;
          fVar150 = auVar110._8_4_;
          fVar179 = auVar110._12_4_;
          fVar174 = auVar110._16_4_;
          fVar176 = auVar110._20_4_;
          fVar173 = auVar110._24_4_;
          auVar59._4_4_ = fVar159 * fVar159 * fVar159 * auVar90._4_4_ * -0.5;
          auVar59._0_4_ = fVar151 * fVar151 * fVar151 * auVar90._0_4_ * -0.5;
          auVar59._8_4_ = fVar150 * fVar150 * fVar150 * auVar90._8_4_ * -0.5;
          auVar59._12_4_ = fVar179 * fVar179 * fVar179 * auVar90._12_4_ * -0.5;
          auVar59._16_4_ = fVar174 * fVar174 * fVar174 * -0.0;
          auVar59._20_4_ = fVar176 * fVar176 * fVar176 * -0.0;
          auVar59._24_4_ = fVar173 * fVar173 * fVar173 * -0.0;
          auVar59._28_4_ = auVar127._28_4_;
          auVar109 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar110 = vfmadd231ps_avx512vl(auVar59,auVar109,auVar110);
          auVar60._4_4_ = auVar127._4_4_ * auVar110._4_4_;
          auVar60._0_4_ = auVar127._0_4_ * auVar110._0_4_;
          auVar60._8_4_ = auVar127._8_4_ * auVar110._8_4_;
          auVar60._12_4_ = auVar127._12_4_ * auVar110._12_4_;
          auVar60._16_4_ = auVar127._16_4_ * auVar110._16_4_;
          auVar60._20_4_ = auVar127._20_4_ * auVar110._20_4_;
          auVar60._24_4_ = auVar127._24_4_ * auVar110._24_4_;
          auVar60._28_4_ = 0;
          auVar61._4_4_ = auVar110._4_4_ * -auVar126._4_4_;
          auVar61._0_4_ = auVar110._0_4_ * -auVar126._0_4_;
          auVar61._8_4_ = auVar110._8_4_ * -auVar126._8_4_;
          auVar61._12_4_ = auVar110._12_4_ * -auVar126._12_4_;
          auVar61._16_4_ = auVar110._16_4_ * -auVar126._16_4_;
          auVar61._20_4_ = auVar110._20_4_ * -auVar126._20_4_;
          auVar61._24_4_ = auVar110._24_4_ * -auVar126._24_4_;
          auVar61._28_4_ = auVar127._28_4_;
          auVar108 = vmulps_avx512vl(auVar110,auVar94);
          auVar110 = vfmadd213ps_avx512vl(auVar128,auVar128,auVar94);
          auVar110 = vfmadd231ps_avx512vl(auVar110,auVar129,auVar129);
          auVar106 = vrsqrt14ps_avx512vl(auVar110);
          auVar110 = vmulps_avx512vl(auVar110,auVar188);
          fVar151 = auVar106._0_4_;
          fVar159 = auVar106._4_4_;
          fVar150 = auVar106._8_4_;
          fVar179 = auVar106._12_4_;
          fVar174 = auVar106._16_4_;
          fVar176 = auVar106._20_4_;
          fVar173 = auVar106._24_4_;
          auVar62._4_4_ = fVar159 * fVar159 * fVar159 * auVar110._4_4_;
          auVar62._0_4_ = fVar151 * fVar151 * fVar151 * auVar110._0_4_;
          auVar62._8_4_ = fVar150 * fVar150 * fVar150 * auVar110._8_4_;
          auVar62._12_4_ = fVar179 * fVar179 * fVar179 * auVar110._12_4_;
          auVar62._16_4_ = fVar174 * fVar174 * fVar174 * auVar110._16_4_;
          auVar62._20_4_ = fVar176 * fVar176 * fVar176 * auVar110._20_4_;
          auVar62._24_4_ = fVar173 * fVar173 * fVar173 * auVar110._24_4_;
          auVar62._28_4_ = auVar110._28_4_;
          auVar110 = vfmadd231ps_avx512vl(auVar62,auVar109,auVar106);
          auVar63._4_4_ = auVar129._4_4_ * auVar110._4_4_;
          auVar63._0_4_ = auVar129._0_4_ * auVar110._0_4_;
          auVar63._8_4_ = auVar129._8_4_ * auVar110._8_4_;
          auVar63._12_4_ = auVar129._12_4_ * auVar110._12_4_;
          auVar63._16_4_ = auVar129._16_4_ * auVar110._16_4_;
          auVar63._20_4_ = auVar129._20_4_ * auVar110._20_4_;
          auVar63._24_4_ = auVar129._24_4_ * auVar110._24_4_;
          auVar63._28_4_ = auVar106._28_4_;
          auVar64._4_4_ = auVar110._4_4_ * auVar107._4_4_;
          auVar64._0_4_ = auVar110._0_4_ * auVar107._0_4_;
          auVar64._8_4_ = auVar110._8_4_ * auVar107._8_4_;
          auVar64._12_4_ = auVar110._12_4_ * auVar107._12_4_;
          auVar64._16_4_ = auVar110._16_4_ * auVar107._16_4_;
          auVar64._20_4_ = auVar110._20_4_ * auVar107._20_4_;
          auVar64._24_4_ = auVar110._24_4_ * auVar107._24_4_;
          auVar64._28_4_ = auVar107._28_4_;
          auVar107 = vmulps_avx512vl(auVar110,auVar94);
          auVar90 = vfmadd213ps_fma(auVar60,ZEXT1632(auVar89),auVar112);
          auVar110 = ZEXT1632(auVar89);
          auVar154 = vfmadd213ps_fma(auVar61,auVar110,auVar113);
          auVar109 = vfmadd213ps_avx512vl(auVar108,auVar110,auVar105);
          auVar106 = vfmadd213ps_avx512vl(auVar63,ZEXT1632(auVar88),auVar114);
          auVar11 = vfnmadd213ps_fma(auVar60,auVar110,auVar112);
          auVar99 = ZEXT1632(auVar88);
          auVar7 = vfmadd213ps_fma(auVar64,auVar99,auVar93);
          auVar91 = vfnmadd213ps_fma(auVar61,auVar110,auVar113);
          auVar8 = vfmadd213ps_fma(auVar107,auVar99,auVar104);
          auVar113 = ZEXT1632(auVar89);
          auVar92 = vfnmadd231ps_fma(auVar105,auVar113,auVar108);
          auVar146 = vfnmadd213ps_fma(auVar63,auVar99,auVar114);
          auVar153 = vfnmadd213ps_fma(auVar64,auVar99,auVar93);
          auVar156 = vfnmadd231ps_fma(auVar104,ZEXT1632(auVar88),auVar107);
          auVar104 = vsubps_avx512vl(auVar106,ZEXT1632(auVar11));
          auVar107 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar91));
          auVar110 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar92));
          auVar65._4_4_ = auVar107._4_4_ * auVar92._4_4_;
          auVar65._0_4_ = auVar107._0_4_ * auVar92._0_4_;
          auVar65._8_4_ = auVar107._8_4_ * auVar92._8_4_;
          auVar65._12_4_ = auVar107._12_4_ * auVar92._12_4_;
          auVar65._16_4_ = auVar107._16_4_ * 0.0;
          auVar65._20_4_ = auVar107._20_4_ * 0.0;
          auVar65._24_4_ = auVar107._24_4_ * 0.0;
          auVar65._28_4_ = auVar108._28_4_;
          auVar89 = vfmsub231ps_fma(auVar65,ZEXT1632(auVar91),auVar110);
          auVar66._4_4_ = auVar110._4_4_ * auVar11._4_4_;
          auVar66._0_4_ = auVar110._0_4_ * auVar11._0_4_;
          auVar66._8_4_ = auVar110._8_4_ * auVar11._8_4_;
          auVar66._12_4_ = auVar110._12_4_ * auVar11._12_4_;
          auVar66._16_4_ = auVar110._16_4_ * 0.0;
          auVar66._20_4_ = auVar110._20_4_ * 0.0;
          auVar66._24_4_ = auVar110._24_4_ * 0.0;
          auVar66._28_4_ = auVar110._28_4_;
          auVar9 = vfmsub231ps_fma(auVar66,ZEXT1632(auVar92),auVar104);
          auVar67._4_4_ = auVar91._4_4_ * auVar104._4_4_;
          auVar67._0_4_ = auVar91._0_4_ * auVar104._0_4_;
          auVar67._8_4_ = auVar91._8_4_ * auVar104._8_4_;
          auVar67._12_4_ = auVar91._12_4_ * auVar104._12_4_;
          auVar67._16_4_ = auVar104._16_4_ * 0.0;
          auVar67._20_4_ = auVar104._20_4_ * 0.0;
          auVar67._24_4_ = auVar104._24_4_ * 0.0;
          auVar67._28_4_ = auVar104._28_4_;
          auVar10 = vfmsub231ps_fma(auVar67,ZEXT1632(auVar11),auVar107);
          auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar10),auVar94,ZEXT1632(auVar9));
          auVar107 = vfmadd231ps_avx512vl(auVar107,auVar94,ZEXT1632(auVar89));
          uVar78 = vcmpps_avx512vl(auVar107,auVar94,2);
          bVar77 = (byte)uVar78;
          fVar87 = (float)((uint)(bVar77 & 1) * auVar90._0_4_ |
                          (uint)!(bool)(bVar77 & 1) * auVar146._0_4_);
          bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
          fVar139 = (float)((uint)bVar18 * auVar90._4_4_ | (uint)!bVar18 * auVar146._4_4_);
          bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
          fVar141 = (float)((uint)bVar18 * auVar90._8_4_ | (uint)!bVar18 * auVar146._8_4_);
          bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
          fVar143 = (float)((uint)bVar18 * auVar90._12_4_ | (uint)!bVar18 * auVar146._12_4_);
          auVar99 = ZEXT1632(CONCAT412(fVar143,CONCAT48(fVar141,CONCAT44(fVar139,fVar87))));
          fVar138 = (float)((uint)(bVar77 & 1) * auVar154._0_4_ |
                           (uint)!(bool)(bVar77 & 1) * auVar153._0_4_);
          bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
          fVar140 = (float)((uint)bVar18 * auVar154._4_4_ | (uint)!bVar18 * auVar153._4_4_);
          bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
          fVar142 = (float)((uint)bVar18 * auVar154._8_4_ | (uint)!bVar18 * auVar153._8_4_);
          bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
          fVar144 = (float)((uint)bVar18 * auVar154._12_4_ | (uint)!bVar18 * auVar153._12_4_);
          auVar100 = ZEXT1632(CONCAT412(fVar144,CONCAT48(fVar142,CONCAT44(fVar140,fVar138))));
          auVar130._0_4_ =
               (float)((uint)(bVar77 & 1) * auVar109._0_4_ |
                      (uint)!(bool)(bVar77 & 1) * auVar156._0_4_);
          bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar130._4_4_ = (float)((uint)bVar18 * auVar109._4_4_ | (uint)!bVar18 * auVar156._4_4_);
          bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar130._8_4_ = (float)((uint)bVar18 * auVar109._8_4_ | (uint)!bVar18 * auVar156._8_4_);
          bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar130._12_4_ =
               (float)((uint)bVar18 * auVar109._12_4_ | (uint)!bVar18 * auVar156._12_4_);
          fVar150 = (float)((uint)((byte)(uVar78 >> 4) & 1) * auVar109._16_4_);
          auVar130._16_4_ = fVar150;
          fVar151 = (float)((uint)((byte)(uVar78 >> 5) & 1) * auVar109._20_4_);
          auVar130._20_4_ = fVar151;
          fVar159 = (float)((uint)((byte)(uVar78 >> 6) & 1) * auVar109._24_4_);
          auVar130._24_4_ = fVar159;
          iVar2 = (uint)(byte)(uVar78 >> 7) * auVar109._28_4_;
          auVar130._28_4_ = iVar2;
          auVar107 = vblendmps_avx512vl(ZEXT1632(auVar11),auVar106);
          auVar131._0_4_ =
               (uint)(bVar77 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar89._0_4_;
          bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar131._4_4_ = (uint)bVar18 * auVar107._4_4_ | (uint)!bVar18 * auVar89._4_4_;
          bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar131._8_4_ = (uint)bVar18 * auVar107._8_4_ | (uint)!bVar18 * auVar89._8_4_;
          bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar131._12_4_ = (uint)bVar18 * auVar107._12_4_ | (uint)!bVar18 * auVar89._12_4_;
          auVar131._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * auVar107._16_4_;
          auVar131._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * auVar107._20_4_;
          auVar131._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * auVar107._24_4_;
          auVar131._28_4_ = (uint)(byte)(uVar78 >> 7) * auVar107._28_4_;
          auVar107 = vblendmps_avx512vl(ZEXT1632(auVar91),ZEXT1632(auVar7));
          auVar132._0_4_ =
               (float)((uint)(bVar77 & 1) * auVar107._0_4_ |
                      (uint)!(bool)(bVar77 & 1) * auVar90._0_4_);
          bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar132._4_4_ = (float)((uint)bVar18 * auVar107._4_4_ | (uint)!bVar18 * auVar90._4_4_);
          bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar132._8_4_ = (float)((uint)bVar18 * auVar107._8_4_ | (uint)!bVar18 * auVar90._8_4_);
          bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar132._12_4_ = (float)((uint)bVar18 * auVar107._12_4_ | (uint)!bVar18 * auVar90._12_4_)
          ;
          fVar179 = (float)((uint)((byte)(uVar78 >> 4) & 1) * auVar107._16_4_);
          auVar132._16_4_ = fVar179;
          fVar174 = (float)((uint)((byte)(uVar78 >> 5) & 1) * auVar107._20_4_);
          auVar132._20_4_ = fVar174;
          fVar176 = (float)((uint)((byte)(uVar78 >> 6) & 1) * auVar107._24_4_);
          auVar132._24_4_ = fVar176;
          auVar132._28_4_ = (uint)(byte)(uVar78 >> 7) * auVar107._28_4_;
          auVar107 = vblendmps_avx512vl(ZEXT1632(auVar92),ZEXT1632(auVar8));
          auVar133._0_4_ =
               (float)((uint)(bVar77 & 1) * auVar107._0_4_ |
                      (uint)!(bool)(bVar77 & 1) * auVar154._0_4_);
          bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar133._4_4_ = (float)((uint)bVar18 * auVar107._4_4_ | (uint)!bVar18 * auVar154._4_4_);
          bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar133._8_4_ = (float)((uint)bVar18 * auVar107._8_4_ | (uint)!bVar18 * auVar154._8_4_);
          bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar133._12_4_ =
               (float)((uint)bVar18 * auVar107._12_4_ | (uint)!bVar18 * auVar154._12_4_);
          fVar86 = (float)((uint)((byte)(uVar78 >> 4) & 1) * auVar107._16_4_);
          auVar133._16_4_ = fVar86;
          fVar175 = (float)((uint)((byte)(uVar78 >> 5) & 1) * auVar107._20_4_);
          auVar133._20_4_ = fVar175;
          fVar173 = (float)((uint)((byte)(uVar78 >> 6) & 1) * auVar107._24_4_);
          auVar133._24_4_ = fVar173;
          iVar3 = (uint)(byte)(uVar78 >> 7) * auVar107._28_4_;
          auVar133._28_4_ = iVar3;
          auVar134._0_4_ =
               (uint)(bVar77 & 1) * (int)auVar11._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar106._0_4_;
          bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar134._4_4_ = (uint)bVar18 * (int)auVar11._4_4_ | (uint)!bVar18 * auVar106._4_4_;
          bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar134._8_4_ = (uint)bVar18 * (int)auVar11._8_4_ | (uint)!bVar18 * auVar106._8_4_;
          bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar134._12_4_ = (uint)bVar18 * (int)auVar11._12_4_ | (uint)!bVar18 * auVar106._12_4_;
          auVar134._16_4_ = (uint)!(bool)((byte)(uVar78 >> 4) & 1) * auVar106._16_4_;
          auVar134._20_4_ = (uint)!(bool)((byte)(uVar78 >> 5) & 1) * auVar106._20_4_;
          auVar134._24_4_ = (uint)!(bool)((byte)(uVar78 >> 6) & 1) * auVar106._24_4_;
          auVar134._28_4_ = (uint)!SUB81(uVar78 >> 7,0) * auVar106._28_4_;
          bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
          bVar20 = (bool)((byte)(uVar78 >> 2) & 1);
          bVar22 = (bool)((byte)(uVar78 >> 3) & 1);
          bVar19 = (bool)((byte)(uVar78 >> 1) & 1);
          bVar21 = (bool)((byte)(uVar78 >> 2) & 1);
          bVar23 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar106 = vsubps_avx512vl(auVar134,auVar99);
          auVar110 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar22 * (int)auVar91._12_4_ |
                                                   (uint)!bVar22 * auVar7._12_4_,
                                                   CONCAT48((uint)bVar20 * (int)auVar91._8_4_ |
                                                            (uint)!bVar20 * auVar7._8_4_,
                                                            CONCAT44((uint)bVar18 *
                                                                     (int)auVar91._4_4_ |
                                                                     (uint)!bVar18 * auVar7._4_4_,
                                                                     (uint)(bVar77 & 1) *
                                                                     (int)auVar91._0_4_ |
                                                                     (uint)!(bool)(bVar77 & 1) *
                                                                     auVar7._0_4_)))),auVar100);
          auVar109 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar23 * (int)auVar92._12_4_ |
                                                   (uint)!bVar23 * auVar8._12_4_,
                                                   CONCAT48((uint)bVar21 * (int)auVar92._8_4_ |
                                                            (uint)!bVar21 * auVar8._8_4_,
                                                            CONCAT44((uint)bVar19 *
                                                                     (int)auVar92._4_4_ |
                                                                     (uint)!bVar19 * auVar8._4_4_,
                                                                     (uint)(bVar77 & 1) *
                                                                     (int)auVar92._0_4_ |
                                                                     (uint)!(bool)(bVar77 & 1) *
                                                                     auVar8._0_4_)))),auVar130);
          auVar108 = vsubps_avx(auVar99,auVar131);
          auVar104 = vsubps_avx(auVar100,auVar132);
          auVar105 = vsubps_avx(auVar130,auVar133);
          auVar68._4_4_ = auVar109._4_4_ * fVar139;
          auVar68._0_4_ = auVar109._0_4_ * fVar87;
          auVar68._8_4_ = auVar109._8_4_ * fVar141;
          auVar68._12_4_ = auVar109._12_4_ * fVar143;
          auVar68._16_4_ = auVar109._16_4_ * 0.0;
          auVar68._20_4_ = auVar109._20_4_ * 0.0;
          auVar68._24_4_ = auVar109._24_4_ * 0.0;
          auVar68._28_4_ = 0;
          auVar89 = vfmsub231ps_fma(auVar68,auVar130,auVar106);
          auVar165._0_4_ = fVar138 * auVar106._0_4_;
          auVar165._4_4_ = fVar140 * auVar106._4_4_;
          auVar165._8_4_ = fVar142 * auVar106._8_4_;
          auVar165._12_4_ = fVar144 * auVar106._12_4_;
          auVar165._16_4_ = auVar106._16_4_ * 0.0;
          auVar165._20_4_ = auVar106._20_4_ * 0.0;
          auVar165._24_4_ = auVar106._24_4_ * 0.0;
          auVar165._28_4_ = 0;
          auVar90 = vfmsub231ps_fma(auVar165,auVar99,auVar110);
          auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar94,ZEXT1632(auVar89));
          auVar169._0_4_ = auVar110._0_4_ * auVar130._0_4_;
          auVar169._4_4_ = auVar110._4_4_ * auVar130._4_4_;
          auVar169._8_4_ = auVar110._8_4_ * auVar130._8_4_;
          auVar169._12_4_ = auVar110._12_4_ * auVar130._12_4_;
          auVar169._16_4_ = auVar110._16_4_ * fVar150;
          auVar169._20_4_ = auVar110._20_4_ * fVar151;
          auVar169._24_4_ = auVar110._24_4_ * fVar159;
          auVar169._28_4_ = 0;
          auVar89 = vfmsub231ps_fma(auVar169,auVar100,auVar109);
          auVar111 = vfmadd231ps_avx512vl(auVar107,auVar94,ZEXT1632(auVar89));
          auVar107 = vmulps_avx512vl(auVar105,auVar131);
          auVar107 = vfmsub231ps_avx512vl(auVar107,auVar108,auVar133);
          auVar69._4_4_ = auVar104._4_4_ * auVar133._4_4_;
          auVar69._0_4_ = auVar104._0_4_ * auVar133._0_4_;
          auVar69._8_4_ = auVar104._8_4_ * auVar133._8_4_;
          auVar69._12_4_ = auVar104._12_4_ * auVar133._12_4_;
          auVar69._16_4_ = auVar104._16_4_ * fVar86;
          auVar69._20_4_ = auVar104._20_4_ * fVar175;
          auVar69._24_4_ = auVar104._24_4_ * fVar173;
          auVar69._28_4_ = iVar3;
          auVar89 = vfmsub231ps_fma(auVar69,auVar132,auVar105);
          auVar170._0_4_ = auVar132._0_4_ * auVar108._0_4_;
          auVar170._4_4_ = auVar132._4_4_ * auVar108._4_4_;
          auVar170._8_4_ = auVar132._8_4_ * auVar108._8_4_;
          auVar170._12_4_ = auVar132._12_4_ * auVar108._12_4_;
          auVar170._16_4_ = fVar179 * auVar108._16_4_;
          auVar170._20_4_ = fVar174 * auVar108._20_4_;
          auVar170._24_4_ = fVar176 * auVar108._24_4_;
          auVar170._28_4_ = 0;
          auVar90 = vfmsub231ps_fma(auVar170,auVar104,auVar131);
          auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar94,auVar107);
          auVar112 = vfmadd231ps_avx512vl(auVar107,auVar94,ZEXT1632(auVar89));
          auVar107 = vmaxps_avx(auVar111,auVar112);
          uVar152 = vcmpps_avx512vl(auVar107,auVar94,2);
          bVar85 = bVar85 & (byte)uVar152;
          if (bVar85 != 0) {
            auVar70._4_4_ = auVar105._4_4_ * auVar110._4_4_;
            auVar70._0_4_ = auVar105._0_4_ * auVar110._0_4_;
            auVar70._8_4_ = auVar105._8_4_ * auVar110._8_4_;
            auVar70._12_4_ = auVar105._12_4_ * auVar110._12_4_;
            auVar70._16_4_ = auVar105._16_4_ * auVar110._16_4_;
            auVar70._20_4_ = auVar105._20_4_ * auVar110._20_4_;
            auVar70._24_4_ = auVar105._24_4_ * auVar110._24_4_;
            auVar70._28_4_ = auVar107._28_4_;
            auVar154 = vfmsub231ps_fma(auVar70,auVar104,auVar109);
            auVar71._4_4_ = auVar109._4_4_ * auVar108._4_4_;
            auVar71._0_4_ = auVar109._0_4_ * auVar108._0_4_;
            auVar71._8_4_ = auVar109._8_4_ * auVar108._8_4_;
            auVar71._12_4_ = auVar109._12_4_ * auVar108._12_4_;
            auVar71._16_4_ = auVar109._16_4_ * auVar108._16_4_;
            auVar71._20_4_ = auVar109._20_4_ * auVar108._20_4_;
            auVar71._24_4_ = auVar109._24_4_ * auVar108._24_4_;
            auVar71._28_4_ = auVar109._28_4_;
            auVar90 = vfmsub231ps_fma(auVar71,auVar106,auVar105);
            auVar72._4_4_ = auVar104._4_4_ * auVar106._4_4_;
            auVar72._0_4_ = auVar104._0_4_ * auVar106._0_4_;
            auVar72._8_4_ = auVar104._8_4_ * auVar106._8_4_;
            auVar72._12_4_ = auVar104._12_4_ * auVar106._12_4_;
            auVar72._16_4_ = auVar104._16_4_ * auVar106._16_4_;
            auVar72._20_4_ = auVar104._20_4_ * auVar106._20_4_;
            auVar72._24_4_ = auVar104._24_4_ * auVar106._24_4_;
            auVar72._28_4_ = auVar104._28_4_;
            auVar7 = vfmsub231ps_fma(auVar72,auVar108,auVar110);
            auVar89 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar90),ZEXT1632(auVar7));
            auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar89),ZEXT1632(auVar154),auVar94);
            auVar110 = vrcp14ps_avx512vl(auVar107);
            auVar108 = auVar197._0_32_;
            auVar109 = vfnmadd213ps_avx512vl(auVar110,auVar107,auVar108);
            auVar89 = vfmadd132ps_fma(auVar109,auVar110,auVar110);
            auVar73._4_4_ = auVar7._4_4_ * auVar130._4_4_;
            auVar73._0_4_ = auVar7._0_4_ * auVar130._0_4_;
            auVar73._8_4_ = auVar7._8_4_ * auVar130._8_4_;
            auVar73._12_4_ = auVar7._12_4_ * auVar130._12_4_;
            auVar73._16_4_ = fVar150 * 0.0;
            auVar73._20_4_ = fVar151 * 0.0;
            auVar73._24_4_ = fVar159 * 0.0;
            auVar73._28_4_ = iVar2;
            auVar90 = vfmadd231ps_fma(auVar73,auVar100,ZEXT1632(auVar90));
            auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar99,ZEXT1632(auVar154));
            fVar151 = auVar89._0_4_;
            fVar159 = auVar89._4_4_;
            fVar150 = auVar89._8_4_;
            fVar179 = auVar89._12_4_;
            local_5a0 = ZEXT1632(CONCAT412(auVar90._12_4_ * fVar179,
                                           CONCAT48(auVar90._8_4_ * fVar150,
                                                    CONCAT44(auVar90._4_4_ * fVar159,
                                                             auVar90._0_4_ * fVar151))));
            auVar75._4_4_ = uStack_67c;
            auVar75._0_4_ = local_680;
            auVar75._8_4_ = uStack_678;
            auVar75._12_4_ = uStack_674;
            auVar75._16_4_ = uStack_670;
            auVar75._20_4_ = uStack_66c;
            auVar75._24_4_ = uStack_668;
            auVar75._28_4_ = uStack_664;
            uVar152 = vcmpps_avx512vl(local_5a0,auVar75,0xd);
            uVar145 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar38._4_4_ = uVar145;
            auVar38._0_4_ = uVar145;
            auVar38._8_4_ = uVar145;
            auVar38._12_4_ = uVar145;
            auVar38._16_4_ = uVar145;
            auVar38._20_4_ = uVar145;
            auVar38._24_4_ = uVar145;
            auVar38._28_4_ = uVar145;
            uVar33 = vcmpps_avx512vl(local_5a0,auVar38,2);
            bVar85 = (byte)uVar152 & (byte)uVar33 & bVar85;
            if (bVar85 != 0) {
              uVar152 = vcmpps_avx512vl(auVar107,auVar94,4);
              bVar85 = bVar85 & (byte)uVar152;
              auVar189 = ZEXT3264(local_840);
              auVar149 = ZEXT3264(local_860);
              if (bVar85 != 0) {
                fVar174 = auVar111._0_4_ * fVar151;
                fVar176 = auVar111._4_4_ * fVar159;
                auVar74._4_4_ = fVar176;
                auVar74._0_4_ = fVar174;
                fVar173 = auVar111._8_4_ * fVar150;
                auVar74._8_4_ = fVar173;
                fVar175 = auVar111._12_4_ * fVar179;
                auVar74._12_4_ = fVar175;
                fVar86 = auVar111._16_4_ * 0.0;
                auVar74._16_4_ = fVar86;
                fVar87 = auVar111._20_4_ * 0.0;
                auVar74._20_4_ = fVar87;
                fVar138 = auVar111._24_4_ * 0.0;
                auVar74._24_4_ = fVar138;
                auVar74._28_4_ = auVar107._28_4_;
                auVar110 = vsubps_avx512vl(auVar108,auVar74);
                local_5e0._0_4_ =
                     (float)((uint)(bVar77 & 1) * (int)fVar174 |
                            (uint)!(bool)(bVar77 & 1) * auVar110._0_4_);
                bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
                local_5e0._4_4_ =
                     (float)((uint)bVar18 * (int)fVar176 | (uint)!bVar18 * auVar110._4_4_);
                bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
                local_5e0._8_4_ =
                     (float)((uint)bVar18 * (int)fVar173 | (uint)!bVar18 * auVar110._8_4_);
                bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
                local_5e0._12_4_ =
                     (float)((uint)bVar18 * (int)fVar175 | (uint)!bVar18 * auVar110._12_4_);
                bVar18 = (bool)((byte)(uVar78 >> 4) & 1);
                local_5e0._16_4_ =
                     (float)((uint)bVar18 * (int)fVar86 | (uint)!bVar18 * auVar110._16_4_);
                bVar18 = (bool)((byte)(uVar78 >> 5) & 1);
                local_5e0._20_4_ =
                     (float)((uint)bVar18 * (int)fVar87 | (uint)!bVar18 * auVar110._20_4_);
                bVar18 = (bool)((byte)(uVar78 >> 6) & 1);
                local_5e0._24_4_ =
                     (float)((uint)bVar18 * (int)fVar138 | (uint)!bVar18 * auVar110._24_4_);
                bVar18 = SUB81(uVar78 >> 7,0);
                local_5e0._28_4_ =
                     (float)((uint)bVar18 * auVar107._28_4_ | (uint)!bVar18 * auVar110._28_4_);
                auVar107 = vsubps_avx(ZEXT1632(auVar88),auVar113);
                auVar89 = vfmadd213ps_fma(auVar107,local_5e0,auVar113);
                uVar145 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
                auVar39._4_4_ = uVar145;
                auVar39._0_4_ = uVar145;
                auVar39._8_4_ = uVar145;
                auVar39._12_4_ = uVar145;
                auVar39._16_4_ = uVar145;
                auVar39._20_4_ = uVar145;
                auVar39._24_4_ = uVar145;
                auVar39._28_4_ = uVar145;
                auVar107 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar89._12_4_ + auVar89._12_4_,
                                                              CONCAT48(auVar89._8_4_ + auVar89._8_4_
                                                                       ,CONCAT44(auVar89._4_4_ +
                                                                                 auVar89._4_4_,
                                                                                 auVar89._0_4_ +
                                                                                 auVar89._0_4_)))),
                                           auVar39);
                uVar152 = vcmpps_avx512vl(local_5a0,auVar107,6);
                if (((byte)uVar152 & bVar85) != 0) {
                  auVar155._0_4_ = auVar112._0_4_ * fVar151;
                  auVar155._4_4_ = auVar112._4_4_ * fVar159;
                  auVar155._8_4_ = auVar112._8_4_ * fVar150;
                  auVar155._12_4_ = auVar112._12_4_ * fVar179;
                  auVar155._16_4_ = auVar112._16_4_ * 0.0;
                  auVar155._20_4_ = auVar112._20_4_ * 0.0;
                  auVar155._24_4_ = auVar112._24_4_ * 0.0;
                  auVar155._28_4_ = 0;
                  auVar107 = vsubps_avx512vl(auVar108,auVar155);
                  auVar135._0_4_ =
                       (uint)(bVar77 & 1) * (int)auVar155._0_4_ |
                       (uint)!(bool)(bVar77 & 1) * auVar107._0_4_;
                  bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
                  auVar135._4_4_ =
                       (uint)bVar18 * (int)auVar155._4_4_ | (uint)!bVar18 * auVar107._4_4_;
                  bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
                  auVar135._8_4_ =
                       (uint)bVar18 * (int)auVar155._8_4_ | (uint)!bVar18 * auVar107._8_4_;
                  bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
                  auVar135._12_4_ =
                       (uint)bVar18 * (int)auVar155._12_4_ | (uint)!bVar18 * auVar107._12_4_;
                  bVar18 = (bool)((byte)(uVar78 >> 4) & 1);
                  auVar135._16_4_ =
                       (uint)bVar18 * (int)auVar155._16_4_ | (uint)!bVar18 * auVar107._16_4_;
                  bVar18 = (bool)((byte)(uVar78 >> 5) & 1);
                  auVar135._20_4_ =
                       (uint)bVar18 * (int)auVar155._20_4_ | (uint)!bVar18 * auVar107._20_4_;
                  bVar18 = (bool)((byte)(uVar78 >> 6) & 1);
                  auVar135._24_4_ =
                       (uint)bVar18 * (int)auVar155._24_4_ | (uint)!bVar18 * auVar107._24_4_;
                  auVar135._28_4_ = (uint)!SUB81(uVar78 >> 7,0) * auVar107._28_4_;
                  auVar40._8_4_ = 0x40000000;
                  auVar40._0_8_ = 0x4000000040000000;
                  auVar40._12_4_ = 0x40000000;
                  auVar40._16_4_ = 0x40000000;
                  auVar40._20_4_ = 0x40000000;
                  auVar40._24_4_ = 0x40000000;
                  auVar40._28_4_ = 0x40000000;
                  local_5c0 = vfmsub132ps_avx512vl(auVar135,auVar108,auVar40);
                  local_580 = (undefined4)lVar80;
                  local_570 = local_7f0._0_8_;
                  uStack_568 = local_7f0._8_8_;
                  local_560 = local_800._0_8_;
                  uStack_558 = local_800._8_8_;
                  local_550 = local_810._0_8_;
                  uStack_548 = local_810._8_8_;
                  pGVar14 = (context->scene->geometries).items[uVar12].ptr;
                  if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
                    bVar77 = 0;
                  }
                  else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                          (bVar77 = 1, pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar89 = vcvtsi2ss_avx512f(auVar190._0_16_,local_580);
                    fVar151 = auVar89._0_4_;
                    local_520[0] = (fVar151 + local_5e0._0_4_ + 0.0) * (float)local_6a0._0_4_;
                    local_520[1] = (fVar151 + local_5e0._4_4_ + 1.0) * (float)local_6a0._4_4_;
                    local_520[2] = (fVar151 + local_5e0._8_4_ + 2.0) * fStack_698;
                    local_520[3] = (fVar151 + local_5e0._12_4_ + 3.0) * fStack_694;
                    fStack_510 = (fVar151 + local_5e0._16_4_ + 4.0) * fStack_690;
                    fStack_50c = (fVar151 + local_5e0._20_4_ + 5.0) * fStack_68c;
                    fStack_508 = (fVar151 + local_5e0._24_4_ + 6.0) * fStack_688;
                    fStack_504 = fVar151 + local_5e0._28_4_ + 7.0;
                    local_500 = local_5c0;
                    local_4e0 = local_5a0;
                    uVar78 = 0;
                    uVar83 = (ulong)((byte)uVar152 & bVar85);
                    for (uVar34 = uVar83; local_57c = iVar13, (uVar34 & 1) == 0;
                        uVar34 = uVar34 >> 1 | 0x8000000000000000) {
                      uVar78 = uVar78 + 1;
                    }
                    while (auVar89 = auVar190._0_16_, uVar83 != 0) {
                      uVar145 = *(undefined4 *)(ray + k * 4 + 0x200);
                      local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_520[uVar78]));
                      local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_500 + uVar78 * 4)));
                      *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_4e0 + uVar78 * 4)
                      ;
                      local_890.context = context->user;
                      fVar159 = local_200._0_4_;
                      fVar151 = 1.0 - fVar159;
                      auVar154 = vfnmadd231ss_fma(ZEXT416((uint)(fVar159 * (fVar151 + fVar151))),
                                                  ZEXT416((uint)fVar151),ZEXT416((uint)fVar151));
                      auVar90 = local_200._0_16_;
                      auVar89 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar90,
                                                ZEXT416(0xc0a00000));
                      auVar88 = vfmadd231ss_fma(ZEXT416((uint)(fVar159 * fVar159 * 3.0)),
                                                ZEXT416((uint)(fVar159 + fVar159)),auVar89);
                      auVar89 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar90,
                                                ZEXT416(0x40000000));
                      auVar89 = vfmadd231ss_fma(ZEXT416((uint)(fVar151 * fVar151 * -3.0)),
                                                ZEXT416((uint)(fVar151 + fVar151)),auVar89);
                      auVar90 = vfmadd231ss_fma(ZEXT416((uint)(fVar159 * fVar159)),auVar90,
                                                ZEXT416((uint)(fVar151 * -2.0)));
                      fVar151 = auVar154._0_4_ * 0.5;
                      fVar159 = auVar88._0_4_ * 0.5;
                      fVar150 = auVar89._0_4_ * 0.5;
                      fVar179 = auVar90._0_4_ * 0.5;
                      auVar162._0_4_ = fVar179 * (float)local_6b0._0_4_;
                      auVar162._4_4_ = fVar179 * (float)local_6b0._4_4_;
                      auVar162._8_4_ = fVar179 * fStack_6a8;
                      auVar162._12_4_ = fVar179 * fStack_6a4;
                      auVar172._4_4_ = fVar150;
                      auVar172._0_4_ = fVar150;
                      auVar172._8_4_ = fVar150;
                      auVar172._12_4_ = fVar150;
                      auVar89 = vfmadd132ps_fma(auVar172,auVar162,local_810);
                      auVar163._4_4_ = fVar159;
                      auVar163._0_4_ = fVar159;
                      auVar163._8_4_ = fVar159;
                      auVar163._12_4_ = fVar159;
                      auVar89 = vfmadd132ps_fma(auVar163,auVar89,local_800);
                      auVar148._4_4_ = fVar151;
                      auVar148._0_4_ = fVar151;
                      auVar148._8_4_ = fVar151;
                      auVar148._12_4_ = fVar151;
                      auVar89 = vfmadd132ps_fma(auVar148,auVar89,local_7f0);
                      auVar149 = vbroadcastss_avx512f(auVar89);
                      auVar195 = vbroadcastss_avx512f(ZEXT416(1));
                      local_280 = vpermps_avx512f(auVar195,ZEXT1664(auVar89));
                      auVar195 = vbroadcastss_avx512f(ZEXT416(2));
                      local_240 = vpermps_avx512f(auVar195,ZEXT1664(auVar89));
                      local_2c0[0] = (RTCHitN)auVar149[0];
                      local_2c0[1] = (RTCHitN)auVar149[1];
                      local_2c0[2] = (RTCHitN)auVar149[2];
                      local_2c0[3] = (RTCHitN)auVar149[3];
                      local_2c0[4] = (RTCHitN)auVar149[4];
                      local_2c0[5] = (RTCHitN)auVar149[5];
                      local_2c0[6] = (RTCHitN)auVar149[6];
                      local_2c0[7] = (RTCHitN)auVar149[7];
                      local_2c0[8] = (RTCHitN)auVar149[8];
                      local_2c0[9] = (RTCHitN)auVar149[9];
                      local_2c0[10] = (RTCHitN)auVar149[10];
                      local_2c0[0xb] = (RTCHitN)auVar149[0xb];
                      local_2c0[0xc] = (RTCHitN)auVar149[0xc];
                      local_2c0[0xd] = (RTCHitN)auVar149[0xd];
                      local_2c0[0xe] = (RTCHitN)auVar149[0xe];
                      local_2c0[0xf] = (RTCHitN)auVar149[0xf];
                      local_2c0[0x10] = (RTCHitN)auVar149[0x10];
                      local_2c0[0x11] = (RTCHitN)auVar149[0x11];
                      local_2c0[0x12] = (RTCHitN)auVar149[0x12];
                      local_2c0[0x13] = (RTCHitN)auVar149[0x13];
                      local_2c0[0x14] = (RTCHitN)auVar149[0x14];
                      local_2c0[0x15] = (RTCHitN)auVar149[0x15];
                      local_2c0[0x16] = (RTCHitN)auVar149[0x16];
                      local_2c0[0x17] = (RTCHitN)auVar149[0x17];
                      local_2c0[0x18] = (RTCHitN)auVar149[0x18];
                      local_2c0[0x19] = (RTCHitN)auVar149[0x19];
                      local_2c0[0x1a] = (RTCHitN)auVar149[0x1a];
                      local_2c0[0x1b] = (RTCHitN)auVar149[0x1b];
                      local_2c0[0x1c] = (RTCHitN)auVar149[0x1c];
                      local_2c0[0x1d] = (RTCHitN)auVar149[0x1d];
                      local_2c0[0x1e] = (RTCHitN)auVar149[0x1e];
                      local_2c0[0x1f] = (RTCHitN)auVar149[0x1f];
                      local_2c0[0x20] = (RTCHitN)auVar149[0x20];
                      local_2c0[0x21] = (RTCHitN)auVar149[0x21];
                      local_2c0[0x22] = (RTCHitN)auVar149[0x22];
                      local_2c0[0x23] = (RTCHitN)auVar149[0x23];
                      local_2c0[0x24] = (RTCHitN)auVar149[0x24];
                      local_2c0[0x25] = (RTCHitN)auVar149[0x25];
                      local_2c0[0x26] = (RTCHitN)auVar149[0x26];
                      local_2c0[0x27] = (RTCHitN)auVar149[0x27];
                      local_2c0[0x28] = (RTCHitN)auVar149[0x28];
                      local_2c0[0x29] = (RTCHitN)auVar149[0x29];
                      local_2c0[0x2a] = (RTCHitN)auVar149[0x2a];
                      local_2c0[0x2b] = (RTCHitN)auVar149[0x2b];
                      local_2c0[0x2c] = (RTCHitN)auVar149[0x2c];
                      local_2c0[0x2d] = (RTCHitN)auVar149[0x2d];
                      local_2c0[0x2e] = (RTCHitN)auVar149[0x2e];
                      local_2c0[0x2f] = (RTCHitN)auVar149[0x2f];
                      local_2c0[0x30] = (RTCHitN)auVar149[0x30];
                      local_2c0[0x31] = (RTCHitN)auVar149[0x31];
                      local_2c0[0x32] = (RTCHitN)auVar149[0x32];
                      local_2c0[0x33] = (RTCHitN)auVar149[0x33];
                      local_2c0[0x34] = (RTCHitN)auVar149[0x34];
                      local_2c0[0x35] = (RTCHitN)auVar149[0x35];
                      local_2c0[0x36] = (RTCHitN)auVar149[0x36];
                      local_2c0[0x37] = (RTCHitN)auVar149[0x37];
                      local_2c0[0x38] = (RTCHitN)auVar149[0x38];
                      local_2c0[0x39] = (RTCHitN)auVar149[0x39];
                      local_2c0[0x3a] = (RTCHitN)auVar149[0x3a];
                      local_2c0[0x3b] = (RTCHitN)auVar149[0x3b];
                      local_2c0[0x3c] = (RTCHitN)auVar149[0x3c];
                      local_2c0[0x3d] = (RTCHitN)auVar149[0x3d];
                      local_2c0[0x3e] = (RTCHitN)auVar149[0x3e];
                      local_2c0[0x3f] = (RTCHitN)auVar149[0x3f];
                      local_180 = local_300._0_8_;
                      uStack_178 = local_300._8_8_;
                      uStack_170 = local_300._16_8_;
                      uStack_168 = local_300._24_8_;
                      uStack_160 = local_300._32_8_;
                      uStack_158 = local_300._40_8_;
                      uStack_150 = local_300._48_8_;
                      uStack_148 = local_300._56_8_;
                      auVar149 = vmovdqa64_avx512f(local_480);
                      local_140 = vmovdqa64_avx512f(auVar149);
                      vpcmpeqd_avx2(auVar149._0_32_,auVar149._0_32_);
                      local_100 = vbroadcastss_avx512f(ZEXT416((local_890.context)->instID[0]));
                      local_c0 = vbroadcastss_avx512f(ZEXT416((local_890.context)->instPrimID[0]));
                      auVar149 = vmovdqa64_avx512f(local_340);
                      local_640 = vmovdqa64_avx512f(auVar149);
                      local_890.valid = (int *)local_640;
                      local_890.geometryUserPtr = pGVar14->userPtr;
                      local_890.hit = local_2c0;
                      local_890.N = 0x10;
                      local_4c0._0_8_ = uVar83;
                      local_890.ray = (RTCRayN *)ray;
                      if (pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar14->occlusionFilterN)(&local_890);
                        auVar149 = vmovdqa64_avx512f(local_640);
                        uVar83 = local_4c0._0_8_;
                      }
                      uVar152 = vptestmd_avx512f(auVar149,auVar149);
                      if ((short)uVar152 != 0) {
                        p_Var17 = context->args->filter;
                        if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar14->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var17)(&local_890);
                          auVar149 = vmovdqa64_avx512f(local_640);
                          uVar83 = local_4c0._0_8_;
                        }
                        auVar89 = auVar190._0_16_;
                        uVar34 = vptestmd_avx512f(auVar149,auVar149);
                        auVar195 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                        bVar18 = (bool)((byte)uVar34 & 1);
                        auVar149._0_4_ =
                             (uint)bVar18 * auVar195._0_4_ |
                             (uint)!bVar18 * *(int *)(local_890.ray + 0x200);
                        bVar18 = (bool)((byte)(uVar34 >> 1) & 1);
                        auVar149._4_4_ =
                             (uint)bVar18 * auVar195._4_4_ |
                             (uint)!bVar18 * *(int *)(local_890.ray + 0x204);
                        bVar18 = (bool)((byte)(uVar34 >> 2) & 1);
                        auVar149._8_4_ =
                             (uint)bVar18 * auVar195._8_4_ |
                             (uint)!bVar18 * *(int *)(local_890.ray + 0x208);
                        bVar18 = (bool)((byte)(uVar34 >> 3) & 1);
                        auVar149._12_4_ =
                             (uint)bVar18 * auVar195._12_4_ |
                             (uint)!bVar18 * *(int *)(local_890.ray + 0x20c);
                        bVar18 = (bool)((byte)(uVar34 >> 4) & 1);
                        auVar149._16_4_ =
                             (uint)bVar18 * auVar195._16_4_ |
                             (uint)!bVar18 * *(int *)(local_890.ray + 0x210);
                        bVar18 = (bool)((byte)(uVar34 >> 5) & 1);
                        auVar149._20_4_ =
                             (uint)bVar18 * auVar195._20_4_ |
                             (uint)!bVar18 * *(int *)(local_890.ray + 0x214);
                        bVar18 = (bool)((byte)(uVar34 >> 6) & 1);
                        auVar149._24_4_ =
                             (uint)bVar18 * auVar195._24_4_ |
                             (uint)!bVar18 * *(int *)(local_890.ray + 0x218);
                        bVar18 = (bool)((byte)(uVar34 >> 7) & 1);
                        auVar149._28_4_ =
                             (uint)bVar18 * auVar195._28_4_ |
                             (uint)!bVar18 * *(int *)(local_890.ray + 0x21c);
                        bVar18 = (bool)((byte)(uVar34 >> 8) & 1);
                        auVar149._32_4_ =
                             (uint)bVar18 * auVar195._32_4_ |
                             (uint)!bVar18 * *(int *)(local_890.ray + 0x220);
                        bVar18 = (bool)((byte)(uVar34 >> 9) & 1);
                        auVar149._36_4_ =
                             (uint)bVar18 * auVar195._36_4_ |
                             (uint)!bVar18 * *(int *)(local_890.ray + 0x224);
                        bVar18 = (bool)((byte)(uVar34 >> 10) & 1);
                        auVar149._40_4_ =
                             (uint)bVar18 * auVar195._40_4_ |
                             (uint)!bVar18 * *(int *)(local_890.ray + 0x228);
                        bVar18 = (bool)((byte)(uVar34 >> 0xb) & 1);
                        auVar149._44_4_ =
                             (uint)bVar18 * auVar195._44_4_ |
                             (uint)!bVar18 * *(int *)(local_890.ray + 0x22c);
                        bVar18 = (bool)((byte)(uVar34 >> 0xc) & 1);
                        auVar149._48_4_ =
                             (uint)bVar18 * auVar195._48_4_ |
                             (uint)!bVar18 * *(int *)(local_890.ray + 0x230);
                        bVar18 = (bool)((byte)(uVar34 >> 0xd) & 1);
                        auVar149._52_4_ =
                             (uint)bVar18 * auVar195._52_4_ |
                             (uint)!bVar18 * *(int *)(local_890.ray + 0x234);
                        bVar18 = (bool)((byte)(uVar34 >> 0xe) & 1);
                        auVar149._56_4_ =
                             (uint)bVar18 * auVar195._56_4_ |
                             (uint)!bVar18 * *(int *)(local_890.ray + 0x238);
                        bVar18 = SUB81(uVar34 >> 0xf,0);
                        auVar149._60_4_ =
                             (uint)bVar18 * auVar195._60_4_ |
                             (uint)!bVar18 * *(int *)(local_890.ray + 0x23c);
                        *(undefined1 (*) [64])(local_890.ray + 0x200) = auVar149;
                        if ((short)uVar34 != 0) {
                          bVar77 = 1;
                          goto LAB_01bb8bdd;
                        }
                      }
                      *(undefined4 *)(ray + k * 4 + 0x200) = uVar145;
                      uVar34 = uVar78 & 0x3f;
                      uVar78 = 0;
                      uVar83 = uVar83 ^ 1L << uVar34;
                      for (uVar34 = uVar83; (uVar34 & 1) == 0;
                          uVar34 = uVar34 >> 1 | 0x8000000000000000) {
                        uVar78 = uVar78 + 1;
                      }
                    }
                    bVar77 = 0;
LAB_01bb8bdd:
                    auVar107 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar197 = ZEXT3264(auVar107);
                    auVar89 = vxorps_avx512vl(auVar89,auVar89);
                    auVar190 = ZEXT1664(auVar89);
                    auVar191 = ZEXT3264(local_6e0);
                    auVar192 = ZEXT3264(local_700);
                    auVar193 = ZEXT3264(local_720);
                    auVar189 = ZEXT3264(local_840);
                    auVar149 = ZEXT3264(local_860);
                    auVar194 = ZEXT3264(local_7e0);
                    auVar195 = ZEXT3264(local_7a0);
                    auVar196 = ZEXT3264(local_7c0);
                  }
                  bVar82 = (bool)(bVar82 | bVar77);
                }
              }
              goto LAB_01bb8bbc;
            }
          }
          auVar189 = ZEXT3264(local_840);
          auVar149 = ZEXT3264(local_860);
        }
LAB_01bb8bbc:
      }
    }
    if (bVar82) break;
    uVar145 = *(undefined4 *)(ray + k * 4 + 0x200);
    auVar37._4_4_ = uVar145;
    auVar37._0_4_ = uVar145;
    auVar37._8_4_ = uVar145;
    auVar37._12_4_ = uVar145;
    auVar37._16_4_ = uVar145;
    auVar37._20_4_ = uVar145;
    auVar37._24_4_ = uVar145;
    auVar37._28_4_ = uVar145;
    uVar152 = vcmpps_avx512vl(local_360,auVar37,2);
  }
  return uVar84 != 0;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }